

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Primitive PVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  RTCFeatureFlags RVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined6 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  int iVar65;
  undefined4 uVar66;
  ulong uVar67;
  long lVar68;
  undefined4 uVar74;
  ulong extraout_RAX;
  ulong uVar69;
  RayHitK<4> *pRVar70;
  undefined1 (*pauVar71) [16];
  ulong extraout_RAX_00;
  RTCFilterFunctionN p_Var72;
  RTCIntersectArguments *pRVar73;
  RTCIntersectArguments *pRVar75;
  ulong uVar76;
  long lVar77;
  long lVar78;
  RTCIntersectArguments *pRVar79;
  int iVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  short sVar87;
  undefined2 uVar125;
  float fVar88;
  float fVar126;
  float fVar127;
  __m128 a_2;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float pp;
  float fVar128;
  float fVar167;
  float fVar168;
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar185;
  float fVar186;
  vfloat4 v;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar204;
  float fVar205;
  vfloat4 v_1;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar238;
  float fVar239;
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar240;
  float fVar248;
  float fVar249;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar259;
  float fVar260;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar261;
  float fVar267;
  float fVar268;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar269;
  float fVar280;
  float fVar281;
  __m128 a_1;
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar282;
  float fVar283;
  float fVar289;
  float fVar291;
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  float fVar290;
  float fVar292;
  float fVar293;
  undefined1 auVar288 [16];
  float fVar294;
  float fVar295;
  float fVar302;
  float fVar304;
  float fVar306;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar300 [16];
  float fVar303;
  float fVar305;
  float fVar307;
  undefined1 auVar301 [16];
  float fVar308;
  float fVar309;
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar314 [16];
  float fVar321;
  float fVar323;
  float fVar325;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar326;
  float fVar327;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar333;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  vfloat<4> rl;
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  vfloat<4> Oz;
  BBox<embree::vfloat_impl<4>_> tp1;
  vfloat<4> dOz;
  vfloat<4> A;
  vfloat<4> B;
  vfloat<4> dOdO;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_678 [8];
  float fStack_670;
  float fStack_66c;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [4];
  float fStack_5b4;
  undefined8 uStack_5b0;
  RTCRayQueryContext *local_5a8;
  RayHitK<4> *local_5a0;
  RTCIntersectArguments *local_598;
  uint local_590;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [16];
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  undefined4 uStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 (*local_468) [16];
  ulong local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  Primitive *local_398;
  ulong local_390;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [12];
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 uVar124;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar237 [16];
  undefined1 auVar246 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  
  PVar21 = prim[1];
  uVar67 = (ulong)(byte)PVar21;
  lVar78 = uVar67 * 0x25;
  pPVar9 = prim + lVar78 + 6;
  fVar186 = *(float *)(pPVar9 + 0xc);
  fVar187 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar186;
  fVar204 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar186;
  fVar205 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar186;
  fVar169 = *(float *)(ray + k * 4 + 0x40) * fVar186;
  fVar185 = *(float *)(ray + k * 4 + 0x50) * fVar186;
  fVar186 = *(float *)(ray + k * 4 + 0x60) * fVar186;
  uVar66 = *(undefined4 *)(prim + uVar67 * 4 + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar81;
  auVar89._12_2_ = uVar125;
  auVar89._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar171._12_4_ = auVar89._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar81;
  auVar171._10_2_ = uVar125;
  auVar274._10_6_ = auVar171._10_6_;
  auVar274._8_2_ = uVar125;
  auVar274._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar44._4_8_ = auVar274._8_8_;
  auVar44._2_2_ = uVar125;
  auVar44._0_2_ = uVar125;
  fVar326 = (float)((int)sVar87 >> 8);
  fVar330 = (float)(auVar44._0_4_ >> 0x18);
  fVar331 = (float)(auVar274._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + uVar67 * 5 + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar81;
  auVar131._12_2_ = uVar125;
  auVar131._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar81;
  auVar130._10_2_ = uVar125;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar125;
  auVar129._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar45._4_8_ = auVar129._8_8_;
  auVar45._2_2_ = uVar125;
  auVar45._0_2_ = uVar125;
  fVar206 = (float)((int)sVar87 >> 8);
  fVar212 = (float)(auVar45._0_4_ >> 0x18);
  fVar213 = (float)(auVar129._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + uVar67 * 6 + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar81;
  auVar134._12_2_ = uVar125;
  auVar134._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar81;
  auVar133._10_2_ = uVar125;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = uVar125;
  auVar132._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar46._4_8_ = auVar132._8_8_;
  auVar46._2_2_ = uVar125;
  auVar46._0_2_ = uVar125;
  fVar240 = (float)((int)sVar87 >> 8);
  fVar248 = (float)(auVar46._0_4_ >> 0x18);
  fVar249 = (float)(auVar132._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + uVar67 * 0xf + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar137._8_4_ = 0;
  auVar137._0_8_ = uVar81;
  auVar137._12_2_ = uVar125;
  auVar137._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar81;
  auVar136._10_2_ = uVar125;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._8_2_ = uVar125;
  auVar135._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar47._4_8_ = auVar135._8_8_;
  auVar47._2_2_ = uVar125;
  auVar47._0_2_ = uVar125;
  fVar88 = (float)((int)sVar87 >> 8);
  fVar126 = (float)(auVar47._0_4_ >> 0x18);
  fVar127 = (float)(auVar135._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + (ulong)(byte)PVar21 * 0x10 + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar81;
  auVar217._12_2_ = uVar125;
  auVar217._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar81;
  auVar216._10_2_ = uVar125;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar125;
  auVar215._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar48._4_8_ = auVar215._8_8_;
  auVar48._2_2_ = uVar125;
  auVar48._0_2_ = uVar125;
  fVar250 = (float)((int)sVar87 >> 8);
  fVar259 = (float)(auVar48._0_4_ >> 0x18);
  fVar260 = (float)(auVar215._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + (ulong)(byte)PVar21 * 0x10 + uVar67 + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar81;
  auVar220._12_2_ = uVar125;
  auVar220._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar81;
  auVar219._10_2_ = uVar125;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar125;
  auVar218._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar49._4_8_ = auVar218._8_8_;
  auVar49._2_2_ = uVar125;
  auVar49._0_2_ = uVar125;
  fVar269 = (float)((int)sVar87 >> 8);
  fVar280 = (float)(auVar49._0_4_ >> 0x18);
  fVar281 = (float)(auVar218._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + uVar67 * 0x1a + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar81;
  auVar223._12_2_ = uVar125;
  auVar223._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar81;
  auVar222._10_2_ = uVar125;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar125;
  auVar221._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar50._4_8_ = auVar221._8_8_;
  auVar50._2_2_ = uVar125;
  auVar50._0_2_ = uVar125;
  fVar261 = (float)((int)sVar87 >> 8);
  fVar267 = (float)(auVar50._0_4_ >> 0x18);
  fVar268 = (float)(auVar221._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + uVar67 * 0x1b + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar81;
  auVar226._12_2_ = uVar125;
  auVar226._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar81;
  auVar225._10_2_ = uVar125;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar125;
  auVar224._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar51._4_8_ = auVar224._8_8_;
  auVar51._2_2_ = uVar125;
  auVar51._0_2_ = uVar125;
  fVar282 = (float)((int)sVar87 >> 8);
  fVar289 = (float)(auVar51._0_4_ >> 0x18);
  fVar291 = (float)(auVar224._8_4_ >> 0x18);
  uVar66 = *(undefined4 *)(prim + uVar67 * 0x1c + 6);
  uVar124 = (undefined1)((uint)uVar66 >> 0x18);
  uVar125 = CONCAT11(uVar124,uVar124);
  uVar124 = (undefined1)((uint)uVar66 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar125,uVar124),CONCAT14(uVar124,uVar66));
  uVar124 = (undefined1)((uint)uVar66 >> 8);
  uVar43 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar124),uVar124);
  sVar87 = CONCAT11((char)uVar66,(char)uVar66);
  uVar81 = CONCAT62(uVar43,sVar87);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar81;
  auVar229._12_2_ = uVar125;
  auVar229._14_2_ = uVar125;
  uVar125 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar81;
  auVar228._10_2_ = uVar125;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar125;
  auVar227._0_8_ = uVar81;
  uVar125 = (undefined2)uVar43;
  auVar52._4_8_ = auVar227._8_8_;
  auVar52._2_2_ = uVar125;
  auVar52._0_2_ = uVar125;
  fVar128 = (float)((int)sVar87 >> 8);
  fVar167 = (float)(auVar52._0_4_ >> 0x18);
  fVar168 = (float)(auVar227._8_4_ >> 0x18);
  fVar308 = fVar169 * fVar326 + fVar185 * fVar206 + fVar186 * fVar240;
  fVar320 = fVar169 * fVar330 + fVar185 * fVar212 + fVar186 * fVar248;
  fVar322 = fVar169 * fVar331 + fVar185 * fVar213 + fVar186 * fVar249;
  fVar324 = fVar169 * (float)(auVar171._12_4_ >> 0x18) +
            fVar185 * (float)(auVar130._12_4_ >> 0x18) + fVar186 * (float)(auVar133._12_4_ >> 0x18);
  fVar294 = fVar169 * fVar88 + fVar185 * fVar250 + fVar186 * fVar269;
  fVar302 = fVar169 * fVar126 + fVar185 * fVar259 + fVar186 * fVar280;
  fVar304 = fVar169 * fVar127 + fVar185 * fVar260 + fVar186 * fVar281;
  fVar306 = fVar169 * (float)(auVar136._12_4_ >> 0x18) +
            fVar185 * (float)(auVar216._12_4_ >> 0x18) + fVar186 * (float)(auVar219._12_4_ >> 0x18);
  fVar214 = fVar169 * fVar261 + fVar185 * fVar282 + fVar186 * fVar128;
  fVar238 = fVar169 * fVar267 + fVar185 * fVar289 + fVar186 * fVar167;
  fVar239 = fVar169 * fVar268 + fVar185 * fVar291 + fVar186 * fVar168;
  fVar169 = fVar169 * (float)(auVar222._12_4_ >> 0x18) +
            fVar185 * (float)(auVar225._12_4_ >> 0x18) + fVar186 * (float)(auVar228._12_4_ >> 0x18);
  fVar327 = fVar326 * fVar187 + fVar206 * fVar204 + fVar240 * fVar205;
  fVar330 = fVar330 * fVar187 + fVar212 * fVar204 + fVar248 * fVar205;
  fVar331 = fVar331 * fVar187 + fVar213 * fVar204 + fVar249 * fVar205;
  fVar332 = (float)(auVar171._12_4_ >> 0x18) * fVar187 +
            (float)(auVar130._12_4_ >> 0x18) * fVar204 + (float)(auVar133._12_4_ >> 0x18) * fVar205;
  fVar269 = fVar88 * fVar187 + fVar250 * fVar204 + fVar269 * fVar205;
  fVar280 = fVar126 * fVar187 + fVar259 * fVar204 + fVar280 * fVar205;
  fVar281 = fVar127 * fVar187 + fVar260 * fVar204 + fVar281 * fVar205;
  fVar326 = (float)(auVar136._12_4_ >> 0x18) * fVar187 +
            (float)(auVar216._12_4_ >> 0x18) * fVar204 + (float)(auVar219._12_4_ >> 0x18) * fVar205;
  fVar261 = fVar187 * fVar261 + fVar204 * fVar282 + fVar205 * fVar128;
  fVar267 = fVar187 * fVar267 + fVar204 * fVar289 + fVar205 * fVar167;
  fVar268 = fVar187 * fVar268 + fVar204 * fVar291 + fVar205 * fVar168;
  fVar282 = fVar187 * (float)(auVar222._12_4_ >> 0x18) +
            fVar204 * (float)(auVar225._12_4_ >> 0x18) + fVar205 * (float)(auVar228._12_4_ >> 0x18);
  fVar186 = (float)DAT_01f80d30;
  fVar88 = DAT_01f80d30._4_4_;
  fVar126 = DAT_01f80d30._8_4_;
  fVar127 = DAT_01f80d30._12_4_;
  uVar82 = -(uint)(fVar186 <= ABS(fVar308));
  uVar83 = -(uint)(fVar88 <= ABS(fVar320));
  uVar84 = -(uint)(fVar126 <= ABS(fVar322));
  uVar85 = -(uint)(fVar127 <= ABS(fVar324));
  auVar310._0_4_ = (uint)fVar308 & uVar82;
  auVar310._4_4_ = (uint)fVar320 & uVar83;
  auVar310._8_4_ = (uint)fVar322 & uVar84;
  auVar310._12_4_ = (uint)fVar324 & uVar85;
  auVar188._0_4_ = ~uVar82 & (uint)fVar186;
  auVar188._4_4_ = ~uVar83 & (uint)fVar88;
  auVar188._8_4_ = ~uVar84 & (uint)fVar126;
  auVar188._12_4_ = ~uVar85 & (uint)fVar127;
  auVar188 = auVar188 | auVar310;
  uVar82 = -(uint)(fVar186 <= ABS(fVar294));
  uVar83 = -(uint)(fVar88 <= ABS(fVar302));
  uVar84 = -(uint)(fVar126 <= ABS(fVar304));
  uVar85 = -(uint)(fVar127 <= ABS(fVar306));
  auVar296._0_4_ = (uint)fVar294 & uVar82;
  auVar296._4_4_ = (uint)fVar302 & uVar83;
  auVar296._8_4_ = (uint)fVar304 & uVar84;
  auVar296._12_4_ = (uint)fVar306 & uVar85;
  auVar241._0_4_ = ~uVar82 & (uint)fVar186;
  auVar241._4_4_ = ~uVar83 & (uint)fVar88;
  auVar241._8_4_ = ~uVar84 & (uint)fVar126;
  auVar241._12_4_ = ~uVar85 & (uint)fVar127;
  auVar241 = auVar241 | auVar296;
  uVar82 = -(uint)(fVar186 <= ABS(fVar214));
  uVar83 = -(uint)(fVar88 <= ABS(fVar238));
  uVar84 = -(uint)(fVar126 <= ABS(fVar239));
  uVar85 = -(uint)(fVar127 <= ABS(fVar169));
  auVar230._0_4_ = (uint)fVar214 & uVar82;
  auVar230._4_4_ = (uint)fVar238 & uVar83;
  auVar230._8_4_ = (uint)fVar239 & uVar84;
  auVar230._12_4_ = (uint)fVar169 & uVar85;
  auVar251._0_4_ = ~uVar82 & (uint)fVar186;
  auVar251._4_4_ = ~uVar83 & (uint)fVar88;
  auVar251._8_4_ = ~uVar84 & (uint)fVar126;
  auVar251._12_4_ = ~uVar85 & (uint)fVar127;
  auVar251 = auVar251 | auVar230;
  auVar89 = rcpps(_DAT_01f80d30,auVar188);
  fVar186 = auVar89._0_4_;
  fVar127 = auVar89._4_4_;
  fVar206 = auVar89._8_4_;
  fVar250 = auVar89._12_4_;
  fVar186 = (1.0 - auVar188._0_4_ * fVar186) * fVar186 + fVar186;
  fVar127 = (1.0 - auVar188._4_4_ * fVar127) * fVar127 + fVar127;
  fVar206 = (1.0 - auVar188._8_4_ * fVar206) * fVar206 + fVar206;
  fVar250 = (1.0 - auVar188._12_4_ * fVar250) * fVar250 + fVar250;
  auVar89 = rcpps(auVar89,auVar241);
  fVar88 = auVar89._0_4_;
  fVar128 = auVar89._4_4_;
  fVar212 = auVar89._8_4_;
  fVar259 = auVar89._12_4_;
  fVar88 = (1.0 - auVar241._0_4_ * fVar88) * fVar88 + fVar88;
  fVar128 = (1.0 - auVar241._4_4_ * fVar128) * fVar128 + fVar128;
  fVar212 = (1.0 - auVar241._8_4_ * fVar212) * fVar212 + fVar212;
  fVar259 = (1.0 - auVar241._12_4_ * fVar259) * fVar259 + fVar259;
  auVar89 = rcpps(auVar89,auVar251);
  fVar126 = auVar89._0_4_;
  fVar167 = auVar89._4_4_;
  fVar213 = auVar89._8_4_;
  fVar260 = auVar89._12_4_;
  fVar126 = (1.0 - auVar251._0_4_ * fVar126) * fVar126 + fVar126;
  fVar167 = (1.0 - auVar251._4_4_ * fVar167) * fVar167 + fVar167;
  fVar213 = (1.0 - auVar251._8_4_ * fVar213) * fVar213 + fVar213;
  fVar260 = (1.0 - auVar251._12_4_ * fVar260) * fVar260 + fVar260;
  fVar289 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar78 + 0x16)) *
            *(float *)(prim + lVar78 + 0x1a);
  uVar81 = *(ulong *)(prim + uVar67 * 7 + 6);
  uVar125 = (undefined2)(uVar81 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar81;
  auVar91._12_2_ = uVar125;
  auVar91._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar81 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar81;
  auVar90._10_2_ = uVar125;
  auVar243._10_6_ = auVar90._10_6_;
  auVar243._8_2_ = uVar125;
  auVar243._0_8_ = uVar81;
  uVar125 = (undefined2)(uVar81 >> 0x10);
  auVar53._4_8_ = auVar243._8_8_;
  auVar53._2_2_ = uVar125;
  auVar53._0_2_ = uVar125;
  fVar168 = (float)(auVar53._0_4_ >> 0x10);
  fVar214 = (float)(auVar243._8_4_ >> 0x10);
  uVar69 = *(ulong *)(prim + uVar67 * 0xb + 6);
  uVar125 = (undefined2)(uVar69 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar69;
  auVar191._12_2_ = uVar125;
  auVar191._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar69 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar69;
  auVar190._10_2_ = uVar125;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar125;
  auVar189._0_8_ = uVar69;
  uVar125 = (undefined2)(uVar69 >> 0x10);
  auVar54._4_8_ = auVar189._8_8_;
  auVar54._2_2_ = uVar125;
  auVar54._0_2_ = uVar125;
  uVar10 = *(ulong *)(prim + uVar67 * 9 + 6);
  uVar125 = (undefined2)(uVar10 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar10;
  auVar94._12_2_ = uVar125;
  auVar94._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar10 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar10;
  auVar93._10_2_ = uVar125;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar125;
  auVar92._0_8_ = uVar10;
  uVar125 = (undefined2)(uVar10 >> 0x10);
  auVar55._4_8_ = auVar92._8_8_;
  auVar55._2_2_ = uVar125;
  auVar55._0_2_ = uVar125;
  fVar169 = (float)(auVar55._0_4_ >> 0x10);
  fVar238 = (float)(auVar92._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar67 * 0xd + 6);
  uVar125 = (undefined2)(uVar11 >> 0x30);
  auVar254._8_4_ = 0;
  auVar254._0_8_ = uVar11;
  auVar254._12_2_ = uVar125;
  auVar254._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar11 >> 0x20);
  auVar253._12_4_ = auVar254._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar11;
  auVar253._10_2_ = uVar125;
  auVar252._10_6_ = auVar253._10_6_;
  auVar252._8_2_ = uVar125;
  auVar252._0_8_ = uVar11;
  uVar125 = (undefined2)(uVar11 >> 0x10);
  auVar56._4_8_ = auVar252._8_8_;
  auVar56._2_2_ = uVar125;
  auVar56._0_2_ = uVar125;
  uVar12 = *(ulong *)(prim + uVar67 * 0x12 + 6);
  uVar125 = (undefined2)(uVar12 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar12;
  auVar97._12_2_ = uVar125;
  auVar97._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar12 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar12;
  auVar96._10_2_ = uVar125;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar125;
  auVar95._0_8_ = uVar12;
  uVar125 = (undefined2)(uVar12 >> 0x10);
  auVar57._4_8_ = auVar95._8_8_;
  auVar57._2_2_ = uVar125;
  auVar57._0_2_ = uVar125;
  fVar185 = (float)(auVar57._0_4_ >> 0x10);
  fVar239 = (float)(auVar95._8_4_ >> 0x10);
  uVar76 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar67 * 2 + uVar76 + 6);
  uVar125 = (undefined2)(uVar13 >> 0x30);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar13;
  auVar272._12_2_ = uVar125;
  auVar272._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar13 >> 0x20);
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._8_2_ = 0;
  auVar271._0_8_ = uVar13;
  auVar271._10_2_ = uVar125;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._8_2_ = uVar125;
  auVar270._0_8_ = uVar13;
  uVar125 = (undefined2)(uVar13 >> 0x10);
  auVar58._4_8_ = auVar270._8_8_;
  auVar58._2_2_ = uVar125;
  auVar58._0_2_ = uVar125;
  uVar76 = *(ulong *)(prim + uVar76 + 6);
  uVar125 = (undefined2)(uVar76 >> 0x30);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar76;
  auVar100._12_2_ = uVar125;
  auVar100._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar76 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar76;
  auVar99._10_2_ = uVar125;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar125;
  auVar98._0_8_ = uVar76;
  uVar125 = (undefined2)(uVar76 >> 0x10);
  auVar59._4_8_ = auVar98._8_8_;
  auVar59._2_2_ = uVar125;
  auVar59._0_2_ = uVar125;
  fVar187 = (float)(auVar59._0_4_ >> 0x10);
  fVar240 = (float)(auVar98._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar67 * 0x18 + 6);
  uVar125 = (undefined2)(uVar14 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar14;
  auVar286._12_2_ = uVar125;
  auVar286._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar14 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar14;
  auVar285._10_2_ = uVar125;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar125;
  auVar284._0_8_ = uVar14;
  uVar125 = (undefined2)(uVar14 >> 0x10);
  auVar60._4_8_ = auVar284._8_8_;
  auVar60._2_2_ = uVar125;
  auVar60._0_2_ = uVar125;
  uVar15 = *(ulong *)(prim + uVar67 * 0x1d + 6);
  uVar125 = (undefined2)(uVar15 >> 0x30);
  auVar103._8_4_ = 0;
  auVar103._0_8_ = uVar15;
  auVar103._12_2_ = uVar125;
  auVar103._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar15 >> 0x20);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._8_2_ = 0;
  auVar102._0_8_ = uVar15;
  auVar102._10_2_ = uVar125;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._8_2_ = uVar125;
  auVar101._0_8_ = uVar15;
  uVar125 = (undefined2)(uVar15 >> 0x10);
  auVar61._4_8_ = auVar101._8_8_;
  auVar61._2_2_ = uVar125;
  auVar61._0_2_ = uVar125;
  fVar204 = (float)(auVar61._0_4_ >> 0x10);
  fVar248 = (float)(auVar101._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar21 * 0x20 + 6);
  uVar125 = (undefined2)(uVar16 >> 0x30);
  auVar299._8_4_ = 0;
  auVar299._0_8_ = uVar16;
  auVar299._12_2_ = uVar125;
  auVar299._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar16 >> 0x20);
  auVar298._12_4_ = auVar299._12_4_;
  auVar298._8_2_ = 0;
  auVar298._0_8_ = uVar16;
  auVar298._10_2_ = uVar125;
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._8_2_ = uVar125;
  auVar297._0_8_ = uVar16;
  uVar125 = (undefined2)(uVar16 >> 0x10);
  auVar62._4_8_ = auVar297._8_8_;
  auVar62._2_2_ = uVar125;
  auVar62._0_2_ = uVar125;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar21 * 0x20 - uVar67) + 6);
  uVar125 = (undefined2)(uVar17 >> 0x30);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar17;
  auVar106._12_2_ = uVar125;
  auVar106._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar17 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar17;
  auVar105._10_2_ = uVar125;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar125;
  auVar104._0_8_ = uVar17;
  uVar125 = (undefined2)(uVar17 >> 0x10);
  auVar63._4_8_ = auVar104._8_8_;
  auVar63._2_2_ = uVar125;
  auVar63._0_2_ = uVar125;
  fVar205 = (float)(auVar63._0_4_ >> 0x10);
  fVar249 = (float)(auVar104._8_4_ >> 0x10);
  uVar67 = *(ulong *)(prim + uVar67 * 0x23 + 6);
  uVar125 = (undefined2)(uVar67 >> 0x30);
  auVar313._8_4_ = 0;
  auVar313._0_8_ = uVar67;
  auVar313._12_2_ = uVar125;
  auVar313._14_2_ = uVar125;
  uVar125 = (undefined2)(uVar67 >> 0x20);
  auVar312._12_4_ = auVar313._12_4_;
  auVar312._8_2_ = 0;
  auVar312._0_8_ = uVar67;
  auVar312._10_2_ = uVar125;
  auVar311._10_6_ = auVar312._10_6_;
  auVar311._8_2_ = uVar125;
  auVar311._0_8_ = uVar67;
  uVar125 = (undefined2)(uVar67 >> 0x10);
  auVar64._4_8_ = auVar311._8_8_;
  auVar64._2_2_ = uVar125;
  auVar64._0_2_ = uVar125;
  auVar192._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar168) * fVar289 + fVar168) - fVar330) *
                fVar127,((((float)(int)(short)uVar69 - (float)(int)(short)uVar81) * fVar289 +
                         (float)(int)(short)uVar81) - fVar327) * fVar186);
  auVar192._8_4_ =
       ((((float)(auVar189._8_4_ >> 0x10) - fVar214) * fVar289 + fVar214) - fVar331) * fVar206;
  auVar192._12_4_ =
       ((((float)(auVar190._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar289 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar332) * fVar250;
  auVar255._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar289 +
        (float)(int)(short)uVar10) - fVar327) * fVar186;
  auVar255._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar169) * fVar289 + fVar169) - fVar330) * fVar127;
  auVar255._8_4_ =
       ((((float)(auVar252._8_4_ >> 0x10) - fVar238) * fVar289 + fVar238) - fVar331) * fVar206;
  auVar255._12_4_ =
       ((((float)(auVar253._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar289 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar332) * fVar250;
  auVar273._0_8_ =
       CONCAT44(((((float)(auVar58._0_4_ >> 0x10) - fVar185) * fVar289 + fVar185) - fVar280) *
                fVar128,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar289 +
                         (float)(int)(short)uVar12) - fVar269) * fVar88);
  auVar273._8_4_ =
       ((((float)(auVar270._8_4_ >> 0x10) - fVar239) * fVar289 + fVar239) - fVar281) * fVar212;
  auVar273._12_4_ =
       ((((float)(auVar271._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar289 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar326) * fVar259;
  auVar287._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar76) * fVar289 +
        (float)(int)(short)uVar76) - fVar269) * fVar88;
  auVar287._4_4_ =
       ((((float)(auVar60._0_4_ >> 0x10) - fVar187) * fVar289 + fVar187) - fVar280) * fVar128;
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar240) * fVar289 + fVar240) - fVar281) * fVar212;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar99._12_4_ >> 0x10)) * fVar289 +
        (float)(auVar99._12_4_ >> 0x10)) - fVar326) * fVar259;
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar300._0_8_ =
       CONCAT44(((((float)(auVar62._0_4_ >> 0x10) - fVar204) * fVar289 + fVar204) - fVar267) *
                fVar167,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar289 +
                         (float)(int)(short)uVar15) - fVar261) * fVar126);
  auVar300._8_4_ =
       ((((float)(auVar297._8_4_ >> 0x10) - fVar248) * fVar289 + fVar248) - fVar268) * fVar213;
  auVar300._12_4_ =
       ((((float)(auVar298._12_4_ >> 0x10) - (float)(auVar102._12_4_ >> 0x10)) * fVar289 +
        (float)(auVar102._12_4_ >> 0x10)) - fVar282) * fVar260;
  auVar314._0_4_ =
       ((((float)(int)(short)uVar67 - (float)(int)(short)uVar17) * fVar289 +
        (float)(int)(short)uVar17) - fVar261) * fVar126;
  auVar314._4_4_ =
       ((((float)(auVar64._0_4_ >> 0x10) - fVar205) * fVar289 + fVar205) - fVar267) * fVar167;
  auVar314._8_4_ =
       ((((float)(auVar311._8_4_ >> 0x10) - fVar249) * fVar289 + fVar249) - fVar268) * fVar213;
  auVar314._12_4_ =
       ((((float)(auVar312._12_4_ >> 0x10) - (float)(auVar105._12_4_ >> 0x10)) * fVar289 +
        (float)(auVar105._12_4_ >> 0x10)) - fVar282) * fVar260;
  auVar170._8_4_ = auVar192._8_4_;
  auVar170._0_8_ = auVar192._0_8_;
  auVar170._12_4_ = auVar192._12_4_;
  auVar171 = minps(auVar170,auVar255);
  auVar138._8_4_ = auVar273._8_4_;
  auVar138._0_8_ = auVar273._0_8_;
  auVar138._12_4_ = auVar273._12_4_;
  auVar89 = minps(auVar138,auVar287);
  auVar171 = maxps(auVar171,auVar89);
  auVar139._8_4_ = auVar300._8_4_;
  auVar139._0_8_ = auVar300._0_8_;
  auVar139._12_4_ = auVar300._12_4_;
  auVar89 = minps(auVar139,auVar314);
  auVar107._4_4_ = uVar66;
  auVar107._0_4_ = uVar66;
  auVar107._8_4_ = uVar66;
  auVar107._12_4_ = uVar66;
  auVar89 = maxps(auVar89,auVar107);
  auVar89 = maxps(auVar171,auVar89);
  auVar171 = maxps(auVar192,auVar255);
  auVar274 = maxps(auVar273,auVar287);
  auVar171 = minps(auVar171,auVar274);
  local_298 = auVar89._0_4_ * 0.99999964;
  fStack_294 = auVar89._4_4_ * 0.99999964;
  fStack_290 = auVar89._8_4_ * 0.99999964;
  fStack_28c = auVar89._12_4_ * 0.99999964;
  auVar89 = maxps(auVar300,auVar314);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar108._4_4_ = uVar66;
  auVar108._0_4_ = uVar66;
  auVar108._8_4_ = uVar66;
  auVar108._12_4_ = uVar66;
  auVar89 = minps(auVar89,auVar108);
  auVar89 = minps(auVar171,auVar89);
  uVar82 = (uint)(byte)PVar21;
  auVar140._0_4_ = -(uint)(uVar82 != 0 && local_298 <= auVar89._0_4_ * 1.0000004);
  auVar140._4_4_ = -(uint)(1 < uVar82 && fStack_294 <= auVar89._4_4_ * 1.0000004);
  auVar140._8_4_ = -(uint)(2 < uVar82 && fStack_290 <= auVar89._8_4_ * 1.0000004);
  auVar140._12_4_ = -(uint)(3 < uVar82 && fStack_28c <= auVar89._12_4_ * 1.0000004);
  uVar82 = movmskps(uVar82,auVar140);
  if (uVar82 == 0) {
    return;
  }
  uVar82 = uVar82 & 0xff;
  local_228._0_12_ = mm_lookupmask_ps._240_12_;
  local_228._12_4_ = 0;
  local_468 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_398 = prim;
LAB_00adcdb7:
  local_390 = (ulong)uVar82;
  lVar78 = 0;
  if (local_390 != 0) {
    for (; (uVar82 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
    }
  }
  uVar82 = *(uint *)(local_398 + 2);
  pRVar79 = (RTCIntersectArguments *)(ulong)uVar82;
  uVar83 = *(uint *)(local_398 + lVar78 * 4 + 6);
  pGVar22 = (context->scene->geometries).items[(long)pRVar79].ptr;
  uVar81 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                           (ulong)uVar83 *
                           pGVar22[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_528 = pGVar22->fnumTimeSegments;
  fVar186 = (pGVar22->time_range).lower;
  fVar88 = ((*(float *)(ray + k * 4 + 0x70) - fVar186) / ((pGVar22->time_range).upper - fVar186)) *
           local_528;
  fVar186 = floorf(fVar88);
  if (local_528 + -1.0 <= fVar186) {
    fVar186 = local_528 + -1.0;
  }
  fVar126 = 0.0;
  if (0.0 <= fVar186) {
    fVar126 = fVar186;
  }
  _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar77 = (long)(int)fVar126 * 0x38;
  lVar78 = *(long *)(_Var23 + 0x10 + lVar77);
  lVar68 = *(long *)(_Var23 + 0x38 + lVar77);
  lVar24 = *(long *)(_Var23 + 0x48 + lVar77);
  pfVar1 = (float *)(lVar68 + uVar81 * lVar24);
  pfVar2 = (float *)(lVar68 + (uVar81 + 1) * lVar24);
  pfVar3 = (float *)(lVar68 + (uVar81 + 2) * lVar24);
  fVar88 = fVar88 - fVar126;
  fVar187 = 1.0 - fVar88;
  pfVar4 = (float *)(lVar68 + lVar24 * (uVar81 + 3));
  pRVar75 = *(RTCIntersectArguments **)(_Var23 + lVar77);
  lVar68 = lVar78 * (uVar81 + 3);
  ppSVar5 = (Scene **)((long)&pRVar75->flags + lVar78 * uVar81);
  ppSVar6 = (Scene **)((long)&pRVar75->flags + lVar78 * (uVar81 + 1));
  ppSVar7 = (Scene **)((long)&pRVar75->flags + lVar78 * (uVar81 + 2));
  local_528 = *(float *)ppSVar5 * fVar187 + *pfVar1 * fVar88;
  local_158 = *(float *)((long)ppSVar5 + 4) * fVar187 + pfVar1[1] * fVar88;
  fStack_520 = *(float *)(ppSVar5 + 1) * fVar187 + pfVar1[2] * fVar88;
  local_408 = *(float *)ppSVar6 * fVar187 + *pfVar2 * fVar88;
  fStack_404 = *(float *)((long)ppSVar6 + 4) * fVar187 + pfVar2[1] * fVar88;
  fStack_400 = *(float *)(ppSVar6 + 1) * fVar187 + pfVar2[2] * fVar88;
  fVar213 = *(float *)ppSVar7 * fVar187 + *pfVar3 * fVar88;
  local_168 = *(float *)((long)ppSVar7 + 4) * fVar187 + pfVar3[1] * fVar88;
  local_178 = *(float *)(ppSVar7 + 1) * fVar187 + pfVar3[2] * fVar88;
  ppSVar8 = (Scene **)((long)&pRVar75->flags + lVar68);
  fVar204 = fVar187 * *(float *)ppSVar8 + fVar88 * *pfVar4;
  fVar205 = fVar187 * *(float *)((long)ppSVar8 + 4) + fVar88 * pfVar4[1];
  fVar206 = fVar187 * *(float *)(ppSVar8 + 1) + fVar88 * pfVar4[2];
  fVar186 = *(float *)(ray + k * 4 + 0x40);
  fVar126 = *(float *)(ray + k * 4 + 0x50);
  fVar127 = *(float *)(ray + k * 4 + 0x60);
  fVar128 = fVar126 * fVar126;
  fVar168 = fVar127 * fVar127;
  fVar167 = fVar128 + fVar186 * fVar186 + fVar168;
  auVar109._0_8_ = CONCAT44(fVar128 + fVar128 + 0.0,fVar167);
  auVar109._8_4_ = fVar128 + fVar168 + fVar168;
  auVar109._12_4_ = fVar128 + 0.0 + 0.0;
  auVar231._8_4_ = auVar109._8_4_;
  auVar231._0_8_ = auVar109._0_8_;
  auVar231._12_4_ = auVar109._12_4_;
  auVar89 = rcpss(auVar231,auVar109);
  local_578 = (2.0 - auVar89._0_4_ * fVar167) * auVar89._0_4_ *
              (((fStack_520 + fStack_400 + local_178 + fVar206) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * fVar127 +
              ((local_158 + fStack_404 + local_168 + fVar205) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * fVar126 +
              ((local_528 + local_408 + fVar213 + fVar204) * 0.25 - *(float *)(ray + k * 4)) *
              fVar186);
  fStack_574 = local_578;
  fStack_570 = local_578;
  fStack_56c = local_578;
  fVar128 = fVar186 * local_578 + *(float *)(ray + k * 4);
  fVar169 = fVar126 * local_578 + *(float *)(ray + k * 4 + 0x10);
  fVar185 = fVar127 * local_578 + *(float *)(ray + k * 4 + 0x20);
  local_528 = local_528 - fVar128;
  local_158 = local_158 - fVar169;
  fStack_520 = fStack_520 - fVar185;
  fStack_51c = (*(float *)((long)ppSVar5 + 0xc) * fVar187 + pfVar1[3] * fVar88) - 0.0;
  fVar213 = fVar213 - fVar128;
  local_168 = local_168 - fVar169;
  local_178 = local_178 - fVar185;
  fStack_40c = (*(float *)((long)ppSVar7 + 0xc) * fVar187 + pfVar3[3] * fVar88) - 0.0;
  local_408 = local_408 - fVar128;
  fStack_404 = fStack_404 - fVar169;
  fStack_400 = fStack_400 - fVar185;
  fVar212 = (*(float *)((long)ppSVar6 + 0xc) * fVar187 + pfVar2[3] * fVar88) - 0.0;
  fVar204 = fVar204 - fVar128;
  fVar205 = fVar205 - fVar169;
  fVar206 = fVar206 - fVar185;
  fVar169 = (fVar187 * *(float *)((long)ppSVar8 + 0xc) + fVar88 * pfVar4[3]) - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fVar88 = fVar126 * fVar126;
  fStack_524 = local_158;
  fStack_13c = fVar186 * fVar186;
  local_148 = fStack_13c + fVar88 + fVar168;
  fStack_144 = fStack_13c + fVar88 + fVar168;
  fStack_140 = fStack_13c + fVar88 + fVar168;
  fStack_13c = fStack_13c + fVar88 + fVar168;
  fStack_3fc = fVar212;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_418 = fVar213;
  fStack_414 = local_168;
  fStack_410 = local_178;
  local_358 = fStack_40c;
  fStack_354 = fStack_40c;
  fStack_350 = fStack_40c;
  fStack_34c = fStack_40c;
  local_188 = fVar204;
  fStack_184 = fVar204;
  fStack_180 = fVar204;
  fStack_17c = fVar204;
  local_198 = fVar205;
  fStack_194 = fVar205;
  fStack_190 = fVar205;
  fStack_18c = fVar205;
  local_1a8 = fVar206;
  fStack_1a4 = fVar206;
  fStack_1a0 = fVar206;
  fStack_19c = fVar206;
  local_1b8 = fVar169;
  fStack_1b4 = fVar169;
  fStack_1b0 = fVar169;
  fStack_1ac = fVar169;
  local_568 = *(float *)(ray + k * 4 + 0x40);
  fStack_564 = local_568;
  fStack_560 = local_568;
  fStack_55c = local_568;
  local_558 = fVar126;
  fStack_554 = fVar126;
  fStack_550 = fVar126;
  fStack_54c = fVar126;
  local_368 = ABS(local_148);
  fStack_364 = ABS(fStack_144);
  fStack_360 = ABS(fStack_140);
  fStack_35c = ABS(fStack_13c);
  fVar88 = *(float *)(ray + k * 4 + 0x30);
  local_3c8 = ZEXT416((uint)local_578);
  local_218 = fVar88 - local_578;
  fStack_214 = local_218;
  fStack_210 = local_218;
  fStack_20c = local_218;
  local_378 = uVar82;
  uStack_374 = uVar82;
  uStack_370 = uVar82;
  uStack_36c = uVar82;
  local_460 = (ulong)uVar83;
  local_388 = uVar83;
  uStack_384 = uVar83;
  uStack_380 = uVar83;
  uStack_37c = uVar83;
  uVar81 = 0;
  fVar128 = 1.4013e-45;
  local_208 = 0.0;
  fStack_204 = 1.0;
  local_258 = local_528;
  fStack_254 = local_528;
  fStack_250 = local_528;
  fStack_24c = local_528;
  local_268 = fStack_520;
  fStack_264 = fStack_520;
  fStack_260 = fStack_520;
  fStack_25c = fStack_520;
  local_428 = fStack_51c;
  fStack_424 = fStack_51c;
  fStack_420 = fStack_51c;
  fStack_41c = fStack_51c;
  local_438 = local_408;
  fStack_434 = local_408;
  fStack_430 = local_408;
  fStack_42c = local_408;
  local_448 = fStack_404;
  fStack_444 = fStack_404;
  fStack_440 = fStack_404;
  fStack_43c = fStack_404;
  local_458 = fStack_400;
  fStack_454 = fStack_400;
  fStack_450 = fStack_400;
  fStack_44c = fStack_400;
  do {
    uVar66 = SUB84(pRVar75,0);
    iVar80 = (int)uVar81;
    fVar280 = fStack_204 - local_208;
    uStack_200 = 0;
    uStack_1fc = 0;
    local_588._4_4_ = local_208;
    local_588._0_4_ = local_208;
    fStack_580 = local_208;
    fStack_57c = local_208;
    fVar238 = fVar280 * 0.0 + local_208;
    fVar239 = fVar280 * 0.33333334 + local_208;
    fVar240 = fVar280 * 0.6666667 + local_208;
    fVar248 = fVar280 * 1.0 + local_208;
    fVar249 = 1.0 - fVar238;
    fVar250 = 1.0 - fVar239;
    fVar260 = 1.0 - fVar240;
    fVar269 = 1.0 - fVar248;
    fVar308 = local_438 * fVar249 + fVar213 * fVar238;
    fVar330 = fStack_434 * fVar250 + fVar213 * fVar239;
    fVar331 = fStack_430 * fVar260 + fVar213 * fVar240;
    fVar332 = fStack_42c * fVar269 + fVar213 * fVar248;
    fVar283 = local_448 * fVar249 + local_168 * fVar238;
    fVar290 = fStack_444 * fVar250 + fStack_164 * fVar239;
    fVar292 = fStack_440 * fVar260 + fStack_160 * fVar240;
    fVar293 = fStack_43c * fVar269 + fStack_15c * fVar248;
    fVar295 = local_458 * fVar249 + local_178 * fVar238;
    fVar303 = fStack_454 * fVar250 + fStack_174 * fVar239;
    fVar305 = fStack_450 * fVar260 + fStack_170 * fVar240;
    fVar307 = fStack_44c * fVar269 + fStack_16c * fVar248;
    fVar259 = fVar212 * fVar249 + local_358 * fVar238;
    fVar320 = fVar212 * fVar250 + fStack_354 * fVar239;
    fVar322 = fVar212 * fVar260 + fStack_350 * fVar240;
    fVar324 = fVar212 * fVar269 + fStack_34c * fVar248;
    fVar168 = (local_258 * fVar249 + local_438 * fVar238) * fVar249 + fVar238 * fVar308;
    fVar185 = (fStack_254 * fVar250 + fStack_434 * fVar239) * fVar250 + fVar239 * fVar330;
    fVar187 = (fStack_250 * fVar260 + fStack_430 * fVar240) * fVar260 + fVar240 * fVar331;
    fVar214 = (fStack_24c * fVar269 + fStack_42c * fVar248) * fVar269 + fVar248 * fVar332;
    fVar281 = (local_158 * fVar249 + local_448 * fVar238) * fVar249 + fVar238 * fVar283;
    fVar326 = (fStack_154 * fVar250 + fStack_444 * fVar239) * fVar250 + fVar239 * fVar290;
    fVar261 = (fStack_150 * fVar260 + fStack_440 * fVar240) * fVar260 + fVar240 * fVar292;
    fVar267 = (fStack_14c * fVar269 + fStack_43c * fVar248) * fVar269 + fVar248 * fVar293;
    fVar268 = (local_268 * fVar249 + local_458 * fVar238) * fVar249 + fVar238 * fVar295;
    fVar282 = (fStack_264 * fVar250 + fStack_454 * fVar239) * fVar250 + fVar239 * fVar303;
    fVar289 = (fStack_260 * fVar260 + fStack_450 * fVar240) * fVar260 + fVar240 * fVar305;
    fVar291 = (fStack_25c * fVar269 + fStack_44c * fVar248) * fVar269 + fVar248 * fVar307;
    fVar294 = (local_428 * fVar249 + fVar212 * fVar238) * fVar249 + fVar238 * fVar259;
    fVar302 = (fStack_424 * fVar250 + fVar212 * fVar239) * fVar250 + fVar239 * fVar320;
    fVar304 = (fStack_420 * fVar260 + fVar212 * fVar240) * fVar260 + fVar240 * fVar322;
    fVar306 = (fStack_41c * fVar269 + fVar212 * fVar248) * fVar269 + fVar248 * fVar324;
    fVar327 = fVar308 * fVar249 + (fVar213 * fVar249 + local_188 * fVar238) * fVar238;
    fVar330 = fVar330 * fVar250 + (fVar213 * fVar250 + fStack_184 * fVar239) * fVar239;
    fVar331 = fVar331 * fVar260 + (fVar213 * fVar260 + fStack_180 * fVar240) * fVar240;
    fVar332 = fVar332 * fVar269 + (fVar213 * fVar269 + fStack_17c * fVar248) * fVar248;
    fVar283 = fVar283 * fVar249 + (local_168 * fVar249 + local_198 * fVar238) * fVar238;
    fVar290 = fVar290 * fVar250 + (fStack_164 * fVar250 + fStack_194 * fVar239) * fVar239;
    fVar292 = fVar292 * fVar260 + (fStack_160 * fVar260 + fStack_190 * fVar240) * fVar240;
    fVar293 = fVar293 * fVar269 + (fStack_15c * fVar269 + fStack_18c * fVar248) * fVar248;
    fVar295 = fVar295 * fVar249 + (local_178 * fVar249 + local_1a8 * fVar238) * fVar238;
    fVar303 = fVar303 * fVar250 + (fStack_174 * fVar250 + fStack_1a4 * fVar239) * fVar239;
    fVar305 = fVar305 * fVar260 + (fStack_170 * fVar260 + fStack_1a0 * fVar240) * fVar240;
    fVar307 = fVar307 * fVar269 + (fStack_16c * fVar269 + fStack_19c * fVar248) * fVar248;
    fVar308 = fVar259 * fVar249 + (local_358 * fVar249 + local_1b8 * fVar238) * fVar238;
    fVar320 = fVar320 * fVar250 + (fStack_354 * fVar250 + fStack_1b4 * fVar239) * fVar239;
    fVar322 = fVar322 * fVar260 + (fStack_350 * fVar260 + fStack_1b0 * fVar240) * fVar240;
    fVar324 = fVar324 * fVar269 + (fStack_34c * fVar269 + fStack_1ac * fVar248) * fVar248;
    local_538 = fVar249 * fVar168 + fVar238 * fVar327;
    fStack_534 = fVar250 * fVar185 + fVar239 * fVar330;
    fStack_530 = fVar260 * fVar187 + fVar240 * fVar331;
    fStack_52c = fVar269 * fVar214 + fVar248 * fVar332;
    fVar333 = fVar249 * fVar281 + fVar238 * fVar283;
    fVar338 = fVar250 * fVar326 + fVar239 * fVar290;
    fVar339 = fVar260 * fVar261 + fVar240 * fVar292;
    fVar340 = fVar269 * fVar267 + fVar248 * fVar293;
    fVar309 = fVar249 * fVar268 + fVar238 * fVar295;
    fVar321 = fVar250 * fVar282 + fVar239 * fVar303;
    fVar323 = fVar260 * fVar289 + fVar240 * fVar305;
    fVar325 = fVar269 * fVar291 + fVar248 * fVar307;
    fVar259 = fVar280 * 0.11111111;
    fVar249 = fVar249 * fVar294 + fVar238 * fVar308;
    fVar250 = fVar250 * fVar302 + fVar239 * fVar320;
    auVar172._0_8_ = CONCAT44(fVar250,fVar249);
    auVar172._8_4_ = fVar260 * fVar304 + fVar240 * fVar322;
    auVar172._12_4_ = fVar269 * fVar306 + fVar248 * fVar324;
    fVar327 = (fVar327 - fVar168) * 3.0 * fVar259;
    local_4e8._0_4_ = (fVar330 - fVar185) * 3.0 * fVar259;
    local_4e8._4_4_ = (fVar331 - fVar187) * 3.0 * fVar259;
    fStack_4e0 = (fVar332 - fVar214) * 3.0 * fVar259;
    local_478 = (fVar283 - fVar281) * 3.0 * fVar259;
    fStack_474 = (fVar290 - fVar326) * 3.0 * fVar259;
    fStack_470 = (fVar292 - fVar261) * 3.0 * fVar259;
    fStack_46c = (fVar293 - fVar267) * 3.0 * fVar259;
    local_488._0_4_ = (fVar295 - fVar268) * 3.0 * fVar259;
    local_488._4_4_ = (fVar303 - fVar282) * 3.0 * fVar259;
    fStack_480 = (fVar305 - fVar289) * 3.0 * fVar259;
    fStack_47c = (fVar307 - fVar291) * 3.0 * fVar259;
    fVar185 = fVar259 * (fVar320 - fVar302) * 3.0;
    fVar214 = fVar259 * (fVar322 - fVar304) * 3.0;
    fVar239 = fVar259 * (fVar324 - fVar306) * 3.0;
    local_498._4_4_ = fStack_530;
    local_498._0_4_ = fStack_534;
    fStack_490 = fStack_52c;
    fStack_48c = 0.0;
    local_4a8._4_4_ = fVar339;
    local_4a8._0_4_ = fVar338;
    fStack_4a0 = fVar340;
    fStack_49c = 0.0;
    local_4b8._4_4_ = fVar323;
    local_4b8._0_4_ = fVar321;
    fStack_4b0 = fVar325;
    fStack_4ac = 0.0;
    auVar141._4_4_ = auVar172._8_4_;
    auVar141._0_4_ = fVar250;
    auVar141._8_4_ = auVar172._12_4_;
    auVar141._12_4_ = 0;
    auVar142._0_8_ = CONCAT44(auVar172._8_4_ - fVar214,fVar250 - fVar185);
    auVar142._8_4_ = auVar172._12_4_ - fVar239;
    auVar142._12_4_ = 0;
    local_3f8 = fVar338 - fVar333;
    fStack_3f4 = fVar339 - fVar338;
    fStack_3f0 = fVar340 - fVar339;
    fStack_3ec = 0.0 - fVar340;
    local_1c8 = fVar321 - fVar309;
    fStack_1c4 = fVar323 - fVar321;
    fStack_1c0 = fVar325 - fVar323;
    fStack_1bc = 0.0 - fVar325;
    fVar326 = local_478 * local_1c8 - (float)local_488._0_4_ * local_3f8;
    fVar261 = fStack_474 * fStack_1c4 - (float)local_488._4_4_ * fStack_3f4;
    fVar267 = fStack_470 * fStack_1c0 - fStack_480 * fStack_3f0;
    fVar268 = fStack_46c * fStack_1bc - fStack_47c * fStack_3ec;
    local_1d8 = fStack_534 - local_538;
    fStack_1d4 = fStack_530 - fStack_534;
    fStack_1d0 = fStack_52c - fStack_530;
    fStack_1cc = 0.0 - fStack_52c;
    fVar248 = (float)local_488._0_4_ * local_1d8 - fVar327 * local_1c8;
    fVar260 = (float)local_488._4_4_ * fStack_1d4 - (float)local_4e8._0_4_ * fStack_1c4;
    fVar269 = fStack_480 * fStack_1d0 - (float)local_4e8._4_4_ * fStack_1c0;
    fVar281 = fStack_47c * fStack_1cc - fStack_4e0 * fStack_1bc;
    fVar282 = fVar327 * local_3f8 - local_478 * local_1d8;
    fVar289 = (float)local_4e8._0_4_ * fStack_3f4 - fStack_474 * fStack_1d4;
    fVar291 = (float)local_4e8._4_4_ * fStack_3f0 - fStack_470 * fStack_1d0;
    fVar302 = fStack_4e0 * fStack_3ec - fStack_46c * fStack_1cc;
    auVar110._0_4_ = local_1c8 * local_1c8;
    auVar110._4_4_ = fStack_1c4 * fStack_1c4;
    auVar110._8_4_ = fStack_1c0 * fStack_1c0;
    auVar110._12_4_ = fStack_1bc * fStack_1bc;
    auVar256._0_4_ = local_1d8 * local_1d8 + local_3f8 * local_3f8 + auVar110._0_4_;
    auVar256._4_4_ = fStack_1d4 * fStack_1d4 + fStack_3f4 * fStack_3f4 + auVar110._4_4_;
    auVar256._8_4_ = fStack_1d0 * fStack_1d0 + fStack_3f0 * fStack_3f0 + auVar110._8_4_;
    auVar256._12_4_ = fStack_1cc * fStack_1cc + fStack_3ec * fStack_3ec + auVar110._12_4_;
    auVar89 = rcpps(auVar110,auVar256);
    fVar168 = auVar89._0_4_;
    fVar187 = auVar89._4_4_;
    fVar238 = auVar89._8_4_;
    fVar240 = auVar89._12_4_;
    fVar168 = (1.0 - fVar168 * auVar256._0_4_) * fVar168 + fVar168;
    fVar187 = (1.0 - fVar187 * auVar256._4_4_) * fVar187 + fVar187;
    fVar238 = (1.0 - fVar238 * auVar256._8_4_) * fVar238 + fVar238;
    fVar240 = (1.0 - fVar240 * auVar256._12_4_) * fVar240 + fVar240;
    fVar304 = local_1c8 * fStack_474 - local_3f8 * (float)local_488._4_4_;
    fVar306 = fStack_1c4 * fStack_470 - fStack_3f4 * fStack_480;
    fVar320 = fStack_1c0 * fStack_46c - fStack_3f0 * fStack_47c;
    fVar322 = fStack_1bc * 0.0 - fStack_3ec * 0.0;
    local_4d8 = (float)local_488._4_4_;
    fStack_4d4 = fStack_480;
    fStack_4d0 = fStack_47c;
    fStack_4cc = 0.0;
    fVar324 = local_1d8 * (float)local_488._4_4_ - local_1c8 * (float)local_4e8._0_4_;
    fVar330 = fStack_1d4 * fStack_480 - fStack_1c4 * (float)local_4e8._4_4_;
    fVar331 = fStack_1d0 * fStack_47c - fStack_1c0 * fStack_4e0;
    fVar332 = fStack_1cc * 0.0 - fStack_1bc * 0.0;
    local_4c8._4_4_ = fStack_470;
    local_4c8._0_4_ = fStack_474;
    fStack_4c0 = fStack_46c;
    fStack_4bc = 0.0;
    uStack_4dc = 0;
    fVar283 = local_3f8 * (float)local_4e8._0_4_ - local_1d8 * fStack_474;
    fVar290 = fStack_3f4 * (float)local_4e8._4_4_ - fStack_1d4 * fStack_470;
    fVar292 = fStack_3f0 * fStack_4e0 - fStack_1d0 * fStack_46c;
    fVar293 = fStack_3ec * 0.0 - fStack_1cc * 0.0;
    auVar328._0_4_ = fVar324 * fVar324 + fVar283 * fVar283;
    auVar328._4_4_ = fVar330 * fVar330 + fVar290 * fVar290;
    auVar328._8_4_ = fVar331 * fVar331 + fVar292 * fVar292;
    auVar328._12_4_ = fVar332 * fVar332 + fVar293 * fVar293;
    auVar242._0_4_ = (fVar326 * fVar326 + fVar248 * fVar248 + fVar282 * fVar282) * fVar168;
    auVar242._4_4_ = (fVar261 * fVar261 + fVar260 * fVar260 + fVar289 * fVar289) * fVar187;
    auVar242._8_4_ = (fVar267 * fVar267 + fVar269 * fVar269 + fVar291 * fVar291) * fVar238;
    auVar242._12_4_ = (fVar268 * fVar268 + fVar281 * fVar281 + fVar302 * fVar302) * fVar240;
    auVar262._0_4_ = (fVar304 * fVar304 + auVar328._0_4_) * fVar168;
    auVar262._4_4_ = (fVar306 * fVar306 + auVar328._4_4_) * fVar187;
    auVar262._8_4_ = (fVar320 * fVar320 + auVar328._8_4_) * fVar238;
    auVar262._12_4_ = (fVar322 * fVar322 + auVar328._12_4_) * fVar240;
    auVar243 = maxps(auVar242,auVar262);
    auVar232._8_4_ = auVar172._8_4_;
    auVar232._0_8_ = auVar172._0_8_;
    auVar232._12_4_ = auVar172._12_4_;
    auVar30._4_4_ = fVar250 + fVar185;
    auVar30._0_4_ = fVar249 + fVar259 * (fVar308 - fVar294) * 3.0;
    auVar30._8_4_ = auVar172._8_4_ + fVar214;
    auVar30._12_4_ = auVar172._12_4_ + fVar239;
    auVar89 = maxps(auVar232,auVar30);
    auVar263._8_4_ = auVar142._8_4_;
    auVar263._0_8_ = auVar142._0_8_;
    auVar263._12_4_ = 0;
    auVar171 = maxps(auVar263,auVar141);
    auVar274 = maxps(auVar89,auVar171);
    auVar171 = minps(auVar172,auVar30);
    auVar89 = minps(auVar142,auVar141);
    auVar171 = minps(auVar171,auVar89);
    auVar89 = sqrtps(auVar89,auVar243);
    auVar243 = rsqrtps(auVar328,auVar256);
    fVar168 = auVar243._0_4_;
    fVar185 = auVar243._4_4_;
    fVar214 = auVar243._8_4_;
    fVar238 = auVar243._12_4_;
    fVar187 = fVar168 * fVar168 * auVar256._0_4_ * -0.5 * fVar168 + fVar168 * 1.5;
    fVar239 = fVar185 * fVar185 * auVar256._4_4_ * -0.5 * fVar185 + fVar185 * 1.5;
    fVar249 = fVar214 * fVar214 * auVar256._8_4_ * -0.5 * fVar214 + fVar214 * 1.5;
    fVar260 = fVar238 * fVar238 * auVar256._12_4_ * -0.5 * fVar238 + fVar238 * 1.5;
    local_4f8 = 0.0 - fVar333;
    fStack_4f4 = 0.0 - fVar338;
    fStack_4f0 = 0.0 - fVar339;
    fStack_4ec = 0.0 - fVar340;
    fVar168 = 0.0 - fVar309;
    fVar214 = 0.0 - fVar321;
    fVar240 = 0.0 - fVar323;
    fVar250 = 0.0 - fVar325;
    fVar291 = 0.0 - local_538;
    fVar294 = 0.0 - fStack_534;
    fVar302 = 0.0 - fStack_530;
    fVar304 = 0.0 - fStack_52c;
    auVar31._4_4_ = fStack_564;
    auVar31._0_4_ = local_568;
    auVar31._8_4_ = fStack_560;
    auVar31._12_4_ = fStack_55c;
    fVar269 = local_568 * local_1d8 * fVar187 +
              local_558 * local_3f8 * fVar187 + fVar127 * local_1c8 * fVar187;
    fVar326 = fStack_564 * fStack_1d4 * fVar239 +
              fStack_554 * fStack_3f4 * fVar239 + fVar127 * fStack_1c4 * fVar239;
    fVar267 = fStack_560 * fStack_1d0 * fVar249 +
              fStack_550 * fStack_3f0 * fVar249 + fVar127 * fStack_1c0 * fVar249;
    fVar282 = fStack_55c * fStack_1cc * fVar260 +
              fStack_54c * fStack_3ec * fVar260 + fVar127 * fStack_1bc * fVar260;
    auVar244._8_4_ = fVar267;
    auVar244._0_8_ = CONCAT44(fVar326,fVar269);
    auVar244._12_4_ = fVar282;
    local_548 = local_1d8 * fVar187 * fVar291 +
                local_3f8 * fVar187 * local_4f8 + local_1c8 * fVar187 * fVar168;
    fStack_544 = fStack_1d4 * fVar239 * fVar294 +
                 fStack_3f4 * fVar239 * fStack_4f4 + fStack_1c4 * fVar239 * fVar214;
    fStack_540 = fStack_1d0 * fVar249 * fVar302 +
                 fStack_3f0 * fVar249 * fStack_4f0 + fStack_1c0 * fVar249 * fVar240;
    fStack_53c = fStack_1cc * fVar260 * fVar304 +
                 fStack_3ec * fVar260 * fStack_4ec + fStack_1bc * fVar260 * fVar250;
    local_1f8 = (local_568 * fVar291 + local_558 * local_4f8 + fVar127 * fVar168) -
                fVar269 * local_548;
    fStack_1f4 = (fStack_564 * fVar294 + fStack_554 * fStack_4f4 + fVar127 * fVar214) -
                 fVar326 * fStack_544;
    fStack_1f0 = (fStack_560 * fVar302 + fStack_550 * fStack_4f0 + fVar127 * fVar240) -
                 fVar267 * fStack_540;
    fStack_1ec = (fStack_55c * fVar304 + fStack_54c * fStack_4ec + fVar127 * fVar250) -
                 fVar282 * fStack_53c;
    fVar185 = (fVar291 * fVar291 + local_4f8 * local_4f8 + fVar168 * fVar168) -
              local_548 * local_548;
    fVar238 = (fVar294 * fVar294 + fStack_4f4 * fStack_4f4 + fVar214 * fVar214) -
              fStack_544 * fStack_544;
    fVar248 = (fVar302 * fVar302 + fStack_4f0 * fStack_4f0 + fVar240 * fVar240) -
              fStack_540 * fStack_540;
    fVar259 = (fVar304 * fVar304 + fStack_4ec * fStack_4ec + fVar250 * fVar250) -
              fStack_53c * fStack_53c;
    fVar281 = (auVar274._0_4_ + auVar89._0_4_) * 1.0000002;
    fVar261 = (auVar274._4_4_ + auVar89._4_4_) * 1.0000002;
    fVar268 = (auVar274._8_4_ + auVar89._8_4_) * 1.0000002;
    fVar289 = (auVar274._12_4_ + auVar89._12_4_) * 1.0000002;
    fVar306 = fVar185 - fVar281 * fVar281;
    fVar308 = fVar238 - fVar261 * fVar261;
    fVar320 = fVar248 - fVar268 * fVar268;
    fVar322 = fVar259 - fVar289 * fVar289;
    local_1e8 = fVar269 * fVar269;
    fStack_1e4 = fVar326 * fVar326;
    fStack_1e0 = fVar267 * fVar267;
    fStack_1dc = fVar282 * fVar282;
    fVar281 = local_148 - local_1e8;
    fVar261 = fStack_144 - fStack_1e4;
    fVar268 = fStack_140 - fStack_1e0;
    fVar289 = fStack_13c - fStack_1dc;
    local_1f8 = local_1f8 + local_1f8;
    fStack_1f4 = fStack_1f4 + fStack_1f4;
    fStack_1f0 = fStack_1f0 + fStack_1f0;
    fStack_1ec = fStack_1ec + fStack_1ec;
    local_518._0_4_ = local_1f8 * local_1f8;
    local_518._4_4_ = fStack_1f4 * fStack_1f4;
    fStack_510 = fStack_1f0 * fStack_1f0;
    fStack_50c = fStack_1ec * fStack_1ec;
    local_3d8._0_4_ = fVar281 * 4.0;
    local_3d8._4_4_ = fVar261 * 4.0;
    fStack_3d0 = fVar268 * 4.0;
    fStack_3cc = fVar289 * 4.0;
    auVar233._0_4_ = (float)local_518._0_4_ - (float)local_3d8._0_4_ * fVar306;
    auVar233._4_4_ = (float)local_518._4_4_ - (float)local_3d8._4_4_ * fVar308;
    auVar233._8_4_ = fStack_510 - fStack_3d0 * fVar320;
    auVar233._12_4_ = fStack_50c - fStack_3cc * fVar322;
    local_3e8._4_4_ = (auVar171._4_4_ - auVar89._4_4_) * 0.99999976;
    local_3e8._0_4_ = (auVar171._0_4_ - auVar89._0_4_) * 0.99999976;
    fStack_3e0 = (auVar171._8_4_ - auVar89._8_4_) * 0.99999976;
    fStack_3dc = (auVar171._12_4_ - auVar89._12_4_) * 0.99999976;
    auVar315._4_4_ = -(uint)(0.0 <= auVar233._4_4_);
    auVar315._0_4_ = -(uint)(0.0 <= auVar233._0_4_);
    auVar315._8_4_ = -(uint)(0.0 <= auVar233._8_4_);
    auVar315._12_4_ = -(uint)(0.0 <= auVar233._12_4_);
    uVar74 = (undefined4)((ulong)lVar68 >> 0x20);
    iVar65 = movmskps((int)lVar68,auVar315);
    if (iVar65 == 0) {
      iVar65 = 0;
      auVar144 = _DAT_01f7a9f0;
      auVar264 = _DAT_01f7aa00;
    }
    else {
      auVar171 = sqrtps(auVar31,auVar233);
      bVar25 = 0.0 <= auVar233._0_4_;
      uVar83 = -(uint)bVar25;
      bVar26 = 0.0 <= auVar233._4_4_;
      uVar84 = -(uint)bVar26;
      bVar27 = 0.0 <= auVar233._8_4_;
      uVar85 = -(uint)bVar27;
      bVar28 = 0.0 <= auVar233._12_4_;
      uVar86 = -(uint)bVar28;
      auVar143._0_4_ = fVar281 + fVar281;
      auVar143._4_4_ = fVar261 + fVar261;
      auVar143._8_4_ = fVar268 + fVar268;
      auVar143._12_4_ = fVar289 + fVar289;
      auVar89 = rcpps(auVar244,auVar143);
      fVar324 = auVar89._0_4_;
      fVar330 = auVar89._4_4_;
      fVar331 = auVar89._8_4_;
      fVar332 = auVar89._12_4_;
      fVar324 = (1.0 - auVar143._0_4_ * fVar324) * fVar324 + fVar324;
      fVar330 = (1.0 - auVar143._4_4_ * fVar330) * fVar330 + fVar330;
      fVar331 = (1.0 - auVar143._8_4_ * fVar331) * fVar331 + fVar331;
      fVar332 = (1.0 - auVar143._12_4_ * fVar332) * fVar332 + fVar332;
      fVar283 = (-local_1f8 - auVar171._0_4_) * fVar324;
      fVar290 = (-fStack_1f4 - auVar171._4_4_) * fVar330;
      fVar292 = (-fStack_1f0 - auVar171._8_4_) * fVar331;
      fVar293 = (-fStack_1ec - auVar171._12_4_) * fVar332;
      fVar324 = (auVar171._0_4_ - local_1f8) * fVar324;
      fVar330 = (auVar171._4_4_ - fStack_1f4) * fVar330;
      fVar331 = (auVar171._8_4_ - fStack_1f0) * fVar331;
      fVar332 = (auVar171._12_4_ - fStack_1ec) * fVar332;
      local_248 = (fVar269 * fVar283 + local_548) * fVar187;
      fStack_244 = (fVar326 * fVar290 + fStack_544) * fVar239;
      fStack_240 = (fVar267 * fVar292 + fStack_540) * fVar249;
      fStack_23c = (fVar282 * fVar293 + fStack_53c) * fVar260;
      local_238 = (fVar269 * fVar324 + local_548) * fVar187;
      fStack_234 = (fVar326 * fVar330 + fStack_544) * fVar239;
      fStack_230 = (fVar267 * fVar331 + fStack_540) * fVar249;
      fStack_22c = (fVar282 * fVar332 + fStack_53c) * fVar260;
      auVar329._0_4_ = (uint)fVar283 & uVar83;
      auVar329._4_4_ = (uint)fVar290 & uVar84;
      auVar329._8_4_ = (uint)fVar292 & uVar85;
      auVar329._12_4_ = (uint)fVar293 & uVar86;
      auVar144._0_8_ = CONCAT44(~uVar84,~uVar83) & 0x7f8000007f800000;
      auVar144._8_4_ = ~uVar85 & 0x7f800000;
      auVar144._12_4_ = ~uVar86 & 0x7f800000;
      auVar144 = auVar144 | auVar329;
      auVar334._0_4_ = (uint)fVar324 & uVar83;
      auVar334._4_4_ = (uint)fVar330 & uVar84;
      auVar334._8_4_ = (uint)fVar331 & uVar85;
      auVar334._12_4_ = (uint)fVar332 & uVar86;
      auVar264._0_8_ = CONCAT44(~uVar84,~uVar83) & 0xff800000ff800000;
      auVar264._8_4_ = ~uVar85 & 0xff800000;
      auVar264._12_4_ = ~uVar86 & 0xff800000;
      auVar264 = auVar264 | auVar334;
      auVar193._0_8_ = CONCAT44(fStack_1e4,local_1e8) & 0x7fffffff7fffffff;
      auVar193._8_4_ = ABS(fStack_1e0);
      auVar193._12_4_ = ABS(fStack_1dc);
      auVar38._4_4_ = fStack_364;
      auVar38._0_4_ = local_368;
      auVar38._8_4_ = fStack_360;
      auVar38._12_4_ = fStack_35c;
      auVar89 = maxps(auVar38,auVar193);
      fVar269 = auVar89._0_4_ * 1.9073486e-06;
      fVar326 = auVar89._4_4_ * 1.9073486e-06;
      fVar267 = auVar89._8_4_ * 1.9073486e-06;
      fVar282 = auVar89._12_4_ * 1.9073486e-06;
      auVar335._0_4_ = -(uint)(ABS(fVar281) < fVar269 && bVar25);
      auVar335._4_4_ = -(uint)(ABS(fVar261) < fVar326 && bVar26);
      auVar335._8_4_ = -(uint)(ABS(fVar268) < fVar267 && bVar27);
      auVar335._12_4_ = -(uint)(ABS(fVar289) < fVar282 && bVar28);
      iVar65 = movmskps(iVar65,auVar335);
      if (iVar65 != 0) {
        uVar83 = -(uint)(fVar306 <= 0.0);
        uVar84 = -(uint)(fVar308 <= 0.0);
        uVar85 = -(uint)(fVar320 <= 0.0);
        uVar86 = -(uint)(fVar322 <= 0.0);
        auVar341._0_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar335._0_4_;
        auVar341._4_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar335._4_4_;
        auVar341._8_4_ = (uVar85 & 0xff800000 | ~uVar85 & 0x7f800000) & auVar335._8_4_;
        auVar341._12_4_ = (uVar86 & 0xff800000 | ~uVar86 & 0x7f800000) & auVar335._12_4_;
        auVar173._0_4_ = ~auVar335._0_4_ & auVar144._0_4_;
        auVar173._4_4_ = ~auVar335._4_4_ & auVar144._4_4_;
        auVar173._8_4_ = ~auVar335._8_4_ & auVar144._8_4_;
        auVar173._12_4_ = ~auVar335._12_4_ & auVar144._12_4_;
        auVar316._0_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar335._0_4_;
        auVar316._4_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar335._4_4_;
        auVar316._8_4_ = (uVar85 & 0x7f800000 | ~uVar85 & 0xff800000) & auVar335._8_4_;
        auVar316._12_4_ = (uVar86 & 0x7f800000 | ~uVar86 & 0xff800000) & auVar335._12_4_;
        auVar336._0_4_ = ~auVar335._0_4_ & auVar264._0_4_;
        auVar336._4_4_ = ~auVar335._4_4_ & auVar264._4_4_;
        auVar336._8_4_ = ~auVar335._8_4_ & auVar264._8_4_;
        auVar336._12_4_ = ~auVar335._12_4_ & auVar264._12_4_;
        auVar315._4_4_ = -(uint)((fVar326 <= ABS(fVar261) || fVar308 <= 0.0) && bVar26);
        auVar315._0_4_ = -(uint)((fVar269 <= ABS(fVar281) || fVar306 <= 0.0) && bVar25);
        auVar315._8_4_ = -(uint)((fVar267 <= ABS(fVar268) || fVar320 <= 0.0) && bVar27);
        auVar315._12_4_ = -(uint)((fVar282 <= ABS(fVar289) || fVar322 <= 0.0) && bVar28);
        auVar144 = auVar173 | auVar341;
        auVar264 = auVar336 | auVar316;
      }
    }
    auVar317._0_4_ = (auVar315._0_4_ << 0x1f) >> 0x1f;
    auVar317._4_4_ = (auVar315._4_4_ << 0x1f) >> 0x1f;
    auVar317._8_4_ = (auVar315._8_4_ << 0x1f) >> 0x1f;
    auVar317._12_4_ = (auVar315._12_4_ << 0x1f) >> 0x1f;
    auVar317 = auVar317 & local_228;
    iVar65 = movmskps(iVar65,auVar317);
    if (iVar65 != 0) {
      _local_288 = auVar244;
      local_278 = fVar281;
      fStack_274 = fVar261;
      fStack_270 = fVar268;
      fStack_26c = fVar289;
      fVar269 = *(float *)(ray + k * 4 + 0x80);
      auVar342._0_4_ = fVar269 - (float)local_3c8._0_4_;
      auVar342._4_4_ = auVar342._0_4_;
      auVar342._8_4_ = auVar342._0_4_;
      auVar342._12_4_ = auVar342._0_4_;
      auVar274 = minps(auVar342,auVar264);
      auVar42._4_4_ = fStack_214;
      auVar42._0_4_ = local_218;
      auVar42._8_4_ = fStack_210;
      auVar42._12_4_ = fStack_20c;
      auVar171 = maxps(auVar42,auVar144);
      auVar145._0_4_ = local_478 * local_558 + (float)local_488._0_4_ * fVar127;
      auVar145._4_4_ = fStack_474 * fStack_554 + (float)local_488._4_4_ * fVar127;
      auVar145._8_4_ = fStack_470 * fStack_550 + fStack_480 * fVar127;
      auVar145._12_4_ = fStack_46c * fStack_54c + fStack_47c * fVar127;
      auVar275._0_4_ = fVar327 * local_568 + auVar145._0_4_;
      auVar275._4_4_ = (float)local_4e8._0_4_ * fStack_564 + auVar145._4_4_;
      auVar275._8_4_ = (float)local_4e8._4_4_ * fStack_560 + auVar145._8_4_;
      auVar275._12_4_ = fStack_4e0 * fStack_55c + auVar145._12_4_;
      auVar89 = rcpps(auVar145,auVar275);
      fVar326 = auVar89._0_4_;
      fVar267 = auVar89._4_4_;
      fVar282 = auVar89._8_4_;
      fVar306 = auVar89._12_4_;
      fVar168 = ((1.0 - auVar275._0_4_ * fVar326) * fVar326 + fVar326) *
                -(fVar291 * fVar327 + local_4f8 * local_478 + fVar168 * (float)local_488._0_4_);
      fVar214 = ((1.0 - auVar275._4_4_ * fVar267) * fVar267 + fVar267) *
                -(fVar294 * (float)local_4e8._0_4_ +
                 fStack_4f4 * fStack_474 + fVar214 * (float)local_488._4_4_);
      fVar240 = ((1.0 - auVar275._8_4_ * fVar282) * fVar282 + fVar282) *
                -(fVar302 * (float)local_4e8._4_4_ + fStack_4f0 * fStack_470 + fVar240 * fStack_480)
      ;
      fVar250 = ((1.0 - auVar275._12_4_ * fVar306) * fVar306 + fVar306) *
                -(fVar304 * fStack_4e0 + fStack_4ec * fStack_46c + fVar250 * fStack_47c);
      auVar174._0_12_ = ZEXT812(0);
      auVar174._12_4_ = 0;
      uVar83 = -(uint)(auVar275._0_4_ < 0.0 || ABS(auVar275._0_4_) < 1e-18);
      uVar84 = -(uint)(auVar275._4_4_ < 0.0 || ABS(auVar275._4_4_) < 1e-18);
      uVar85 = -(uint)(auVar275._8_4_ < 0.0 || ABS(auVar275._8_4_) < 1e-18);
      uVar86 = -(uint)(auVar275._12_4_ < 0.0 || ABS(auVar275._12_4_) < 1e-18);
      auVar194._0_8_ = CONCAT44(uVar84,uVar83) & 0xff800000ff800000;
      auVar194._8_4_ = uVar85 & 0xff800000;
      auVar194._12_4_ = uVar86 & 0xff800000;
      auVar146._0_4_ = ~uVar83 & (uint)fVar168;
      auVar146._4_4_ = ~uVar84 & (uint)fVar214;
      auVar146._8_4_ = ~uVar85 & (uint)fVar240;
      auVar146._12_4_ = ~uVar86 & (uint)fVar250;
      auVar171 = maxps(auVar171,auVar146 | auVar194);
      uVar83 = -(uint)(0.0 < auVar275._0_4_ || ABS(auVar275._0_4_) < 1e-18);
      uVar84 = -(uint)(0.0 < auVar275._4_4_ || ABS(auVar275._4_4_) < 1e-18);
      uVar85 = -(uint)(0.0 < auVar275._8_4_ || ABS(auVar275._8_4_) < 1e-18);
      uVar86 = -(uint)(0.0 < auVar275._12_4_ || ABS(auVar275._12_4_) < 1e-18);
      auVar147._0_8_ = CONCAT44(uVar84,uVar83) & 0x7f8000007f800000;
      auVar147._8_4_ = uVar85 & 0x7f800000;
      auVar147._12_4_ = uVar86 & 0x7f800000;
      auVar276._0_4_ = ~uVar83 & (uint)fVar168;
      auVar276._4_4_ = ~uVar84 & (uint)fVar214;
      auVar276._8_4_ = ~uVar85 & (uint)fVar240;
      auVar276._12_4_ = ~uVar86 & (uint)fVar250;
      auVar274 = minps(auVar274,auVar276 | auVar147);
      auVar195._0_4_ = (0.0 - fVar338) * -fStack_474 + (0.0 - fVar321) * -(float)local_488._4_4_;
      auVar195._4_4_ = (0.0 - fVar339) * -fStack_470 + (0.0 - fVar323) * -fStack_480;
      auVar195._8_4_ = (0.0 - fVar340) * -fStack_46c + (0.0 - fVar325) * -fStack_47c;
      auVar195._12_4_ = 0x80000000;
      auVar111._0_4_ =
           -(float)local_4e8._0_4_ * local_568 +
           -fStack_474 * local_558 + -(float)local_488._4_4_ * fVar127;
      auVar111._4_4_ =
           -(float)local_4e8._4_4_ * fStack_564 + -fStack_470 * fStack_554 + -fStack_480 * fVar127;
      auVar111._8_4_ = -fStack_4e0 * fStack_560 + -fStack_46c * fStack_550 + -fStack_47c * fVar127;
      auVar111._12_4_ = fStack_55c * -0.0 + fStack_54c * -0.0 + fVar127 * -0.0;
      auVar89 = rcpps(auVar195,auVar111);
      fVar168 = auVar89._0_4_;
      fVar214 = auVar89._4_4_;
      fVar240 = auVar89._8_4_;
      fVar250 = auVar89._12_4_;
      fVar168 = (((float)DAT_01f7ba10 - auVar111._0_4_ * fVar168) * fVar168 + fVar168) *
                -((0.0 - fStack_534) * -(float)local_4e8._0_4_ + auVar195._0_4_);
      fVar214 = ((DAT_01f7ba10._4_4_ - auVar111._4_4_ * fVar214) * fVar214 + fVar214) *
                -((0.0 - fStack_530) * -(float)local_4e8._4_4_ + auVar195._4_4_);
      fVar240 = ((DAT_01f7ba10._8_4_ - auVar111._8_4_ * fVar240) * fVar240 + fVar240) *
                -((0.0 - fStack_52c) * -fStack_4e0 + auVar195._8_4_);
      fVar250 = ((DAT_01f7ba10._12_4_ - auVar111._12_4_ * fVar250) * fVar250 + fVar250) * 0.0;
      uVar83 = -(uint)(auVar111._0_4_ < 0.0 || ABS(auVar111._0_4_) < 1e-18);
      uVar84 = -(uint)(auVar111._4_4_ < 0.0 || ABS(auVar111._4_4_) < 1e-18);
      uVar85 = -(uint)(auVar111._8_4_ < 0.0 || ABS(auVar111._8_4_) < 1e-18);
      uVar86 = -(uint)(auVar111._12_4_ < 0.0 || ABS(auVar111._12_4_) < 1e-18);
      auVar196._0_8_ = CONCAT44(uVar84,uVar83) & 0xff800000ff800000;
      auVar196._8_4_ = uVar85 & 0xff800000;
      auVar196._12_4_ = uVar86 & 0xff800000;
      auVar148._0_4_ = ~uVar83 & (uint)fVar168;
      auVar148._4_4_ = ~uVar84 & (uint)fVar214;
      auVar148._8_4_ = ~uVar85 & (uint)fVar240;
      auVar148._12_4_ = ~uVar86 & (uint)fVar250;
      local_508 = maxps(auVar171,auVar148 | auVar196);
      uVar83 = -(uint)(0.0 < auVar111._0_4_ || ABS(auVar111._0_4_) < 1e-18);
      uVar84 = -(uint)(0.0 < auVar111._4_4_ || ABS(auVar111._4_4_) < 1e-18);
      uVar85 = -(uint)(0.0 < auVar111._8_4_ || ABS(auVar111._8_4_) < 1e-18);
      uVar86 = -(uint)(0.0 < auVar111._12_4_ || ABS(auVar111._12_4_) < 1e-18);
      auVar149._0_8_ = CONCAT44(uVar84,uVar83) & 0x7f8000007f800000;
      auVar149._8_4_ = uVar85 & 0x7f800000;
      auVar149._12_4_ = uVar86 & 0x7f800000;
      auVar112._0_4_ = ~uVar83 & (uint)fVar168;
      auVar112._4_4_ = ~uVar84 & (uint)fVar214;
      auVar112._8_4_ = ~uVar85 & (uint)fVar240;
      auVar112._12_4_ = ~uVar86 & (uint)fVar250;
      auVar89 = minps(auVar274,auVar112 | auVar149);
      fVar168 = local_508._12_4_;
      fVar214 = local_508._0_4_;
      fVar240 = local_508._4_4_;
      fVar250 = local_508._8_4_;
      auVar337._0_4_ = -(uint)(fVar214 <= auVar89._0_4_) & auVar317._0_4_;
      auVar337._4_4_ = -(uint)(fVar240 <= auVar89._4_4_) & auVar317._4_4_;
      auVar337._8_4_ = -(uint)(fVar250 <= auVar89._8_4_) & auVar317._8_4_;
      auVar337._12_4_ = -(uint)(fVar168 <= auVar89._12_4_) & auVar317._12_4_;
      iVar65 = movmskps(iVar65,auVar337);
      if (iVar65 != 0) {
        auVar171 = maxps(ZEXT816(0),_local_3e8);
        auVar40._4_4_ = fStack_244;
        auVar40._0_4_ = local_248;
        auVar40._8_4_ = fStack_240;
        auVar40._12_4_ = fStack_23c;
        auVar274 = minps(auVar40,_DAT_01f7ba10);
        auVar243 = maxps(auVar274,auVar174);
        auVar41._4_4_ = fStack_234;
        auVar41._0_4_ = local_238;
        auVar41._8_4_ = fStack_230;
        auVar41._12_4_ = fStack_22c;
        auVar274 = minps(auVar41,_DAT_01f7ba10);
        auVar274 = maxps(auVar274,auVar174);
        local_108[0] = (auVar243._0_4_ + 0.0) * 0.25 * fVar280 + local_208;
        local_108[1] = (auVar243._4_4_ + 1.0) * 0.25 * fVar280 + local_208;
        local_108[2] = (auVar243._8_4_ + 2.0) * 0.25 * fVar280 + local_208;
        local_108[3] = (auVar243._12_4_ + 3.0) * 0.25 * fVar280 + local_208;
        auVar175._0_12_ = ZEXT812(0);
        auVar175._12_4_ = 0;
        local_118[0] = (auVar274._0_4_ + 0.0) * 0.25 * fVar280 + local_208;
        local_118[1] = (auVar274._4_4_ + 1.0) * 0.25 * fVar280 + local_208;
        local_118[2] = (auVar274._8_4_ + 2.0) * 0.25 * fVar280 + local_208;
        local_118[3] = (auVar274._12_4_ + 3.0) * 0.25 * fVar280 + local_208;
        fVar185 = fVar185 - auVar171._0_4_ * auVar171._0_4_;
        fVar238 = fVar238 - auVar171._4_4_ * auVar171._4_4_;
        fVar248 = fVar248 - auVar171._8_4_ * auVar171._8_4_;
        fVar259 = fVar259 - auVar171._12_4_ * auVar171._12_4_;
        auVar301._0_4_ = (float)local_518._0_4_ - (float)local_3d8._0_4_ * fVar185;
        auVar301._4_4_ = (float)local_518._4_4_ - (float)local_3d8._4_4_ * fVar238;
        auVar301._8_4_ = fStack_510 - fStack_3d0 * fVar248;
        auVar301._12_4_ = fStack_50c - fStack_3cc * fVar259;
        local_518._4_4_ = -(uint)(0.0 <= auVar301._4_4_);
        local_518._0_4_ = -(uint)(0.0 <= auVar301._0_4_);
        fStack_510 = (float)-(uint)(0.0 <= auVar301._8_4_);
        fStack_50c = (float)-(uint)(0.0 <= auVar301._12_4_);
        iVar65 = movmskps(iVar65,_local_518);
        auVar319._4_4_ = fVar205;
        auVar319._0_4_ = fVar204;
        auVar319._8_4_ = fVar206;
        auVar319._12_4_ = fVar169;
        if (iVar65 == 0) {
          _local_638 = ZEXT816(0);
          fVar280 = 0.0;
          fVar326 = 0.0;
          fVar267 = 0.0;
          fVar282 = 0.0;
          fVar187 = 0.0;
          fVar239 = 0.0;
          fVar249 = 0.0;
          fVar260 = 0.0;
          local_618 = 0.0;
          fStack_614 = 0.0;
          fStack_610 = 0.0;
          fStack_60c = 0.0;
          _local_678 = ZEXT816(0);
          _local_588 = ZEXT816(0);
          iVar65 = 0;
          auVar113 = _DAT_01f7a9f0;
          auVar257 = _DAT_01f7aa00;
        }
        else {
          auVar274 = sqrtps(_DAT_01f7ba10,auVar301);
          auVar150._0_4_ = fVar281 + fVar281;
          auVar150._4_4_ = fVar261 + fVar261;
          auVar150._8_4_ = fVar268 + fVar268;
          auVar150._12_4_ = fVar289 + fVar289;
          auVar171 = rcpps(auVar175,auVar150);
          fVar291 = auVar171._0_4_;
          fVar294 = auVar171._4_4_;
          fVar302 = auVar171._8_4_;
          fVar304 = auVar171._12_4_;
          fVar291 = ((float)DAT_01f7ba10 - auVar150._0_4_ * fVar291) * fVar291 + fVar291;
          fVar294 = (DAT_01f7ba10._4_4_ - auVar150._4_4_ * fVar294) * fVar294 + fVar294;
          fVar302 = (DAT_01f7ba10._8_4_ - auVar150._8_4_ * fVar302) * fVar302 + fVar302;
          fVar304 = (DAT_01f7ba10._12_4_ - auVar150._12_4_ * fVar304) * fVar304 + fVar304;
          fVar306 = (-local_1f8 - auVar274._0_4_) * fVar291;
          fVar308 = (-fStack_1f4 - auVar274._4_4_) * fVar294;
          fVar320 = (-fStack_1f0 - auVar274._8_4_) * fVar302;
          fVar322 = (-fStack_1ec - auVar274._12_4_) * fVar304;
          fVar291 = (auVar274._0_4_ - local_1f8) * fVar291;
          fVar294 = (auVar274._4_4_ - fStack_1f4) * fVar294;
          fVar302 = (auVar274._8_4_ - fStack_1f0) * fVar302;
          fVar304 = (auVar274._12_4_ - fStack_1ec) * fVar304;
          local_288._0_4_ = auVar244._0_4_;
          local_288._4_4_ = auVar244._4_4_;
          fStack_280 = auVar244._8_4_;
          fStack_27c = auVar244._12_4_;
          fVar280 = ((float)local_288._0_4_ * fVar306 + local_548) * fVar187;
          fVar326 = ((float)local_288._4_4_ * fVar308 + fStack_544) * fVar239;
          fVar267 = (fStack_280 * fVar320 + fStack_540) * fVar249;
          fVar282 = (fStack_27c * fVar322 + fStack_53c) * fVar260;
          local_618 = local_568 * fVar306 - (local_1d8 * fVar280 + local_538);
          fStack_614 = fStack_564 * fVar308 - (fStack_1d4 * fVar326 + fStack_534);
          fStack_610 = fStack_560 * fVar320 - (fStack_1d0 * fVar267 + fStack_530);
          fStack_60c = fStack_55c * fVar322 - (fStack_1cc * fVar282 + fStack_52c);
          local_678._4_4_ = fStack_554 * fVar308 - (fStack_3f4 * fVar326 + fVar338);
          local_678._0_4_ = local_558 * fVar306 - (local_3f8 * fVar280 + fVar333);
          fStack_670 = fStack_550 * fVar320 - (fStack_3f0 * fVar267 + fVar339);
          fStack_66c = fStack_54c * fVar322 - (fStack_3ec * fVar282 + fVar340);
          local_588._4_4_ = fVar127 * fVar308 - (fVar326 * fStack_1c4 + fVar321);
          local_588._0_4_ = fVar127 * fVar306 - (fVar280 * local_1c8 + fVar309);
          fStack_580 = fVar127 * fVar320 - (fVar267 * fStack_1c0 + fVar323);
          fStack_57c = fVar127 * fVar322 - (fVar282 * fStack_1bc + fVar325);
          fVar187 = ((float)local_288._0_4_ * fVar291 + local_548) * fVar187;
          fVar239 = ((float)local_288._4_4_ * fVar294 + fStack_544) * fVar239;
          fVar249 = (fStack_280 * fVar302 + fStack_540) * fVar249;
          fVar260 = (fStack_27c * fVar304 + fStack_53c) * fVar260;
          local_638._4_4_ = fStack_564 * fVar294 - (fStack_1d4 * fVar239 + fStack_534);
          local_638._0_4_ = local_568 * fVar291 - (local_1d8 * fVar187 + local_538);
          fStack_630 = fStack_560 * fVar302 - (fStack_1d0 * fVar249 + fStack_530);
          fStack_62c = fStack_55c * fVar304 - (fStack_1cc * fVar260 + fStack_52c);
          fVar280 = local_558 * fVar291 - (local_3f8 * fVar187 + fVar333);
          fVar326 = fStack_554 * fVar294 - (fStack_3f4 * fVar239 + fVar338);
          fVar267 = fStack_550 * fVar302 - (fStack_3f0 * fVar249 + fVar339);
          fVar282 = fStack_54c * fVar304 - (fStack_3ec * fVar260 + fVar340);
          bVar25 = 0.0 <= auVar301._0_4_;
          uVar83 = -(uint)bVar25;
          bVar26 = 0.0 <= auVar301._4_4_;
          uVar84 = -(uint)bVar26;
          bVar27 = 0.0 <= auVar301._8_4_;
          uVar85 = -(uint)bVar27;
          bVar28 = 0.0 <= auVar301._12_4_;
          uVar86 = -(uint)bVar28;
          fVar187 = fVar127 * fVar291 - (fVar187 * local_1c8 + fVar309);
          fVar239 = fVar127 * fVar294 - (fVar239 * fStack_1c4 + fVar321);
          fVar249 = fVar127 * fVar302 - (fVar249 * fStack_1c0 + fVar323);
          fVar260 = fVar127 * fVar304 - (fVar260 * fStack_1bc + fVar325);
          auVar245._0_4_ = (uint)fVar306 & uVar83;
          auVar245._4_4_ = (uint)fVar308 & uVar84;
          auVar245._8_4_ = (uint)fVar320 & uVar85;
          auVar245._12_4_ = (uint)fVar322 & uVar86;
          auVar113._0_8_ = CONCAT44(~uVar84,~uVar83) & 0x7f8000007f800000;
          auVar113._8_4_ = ~uVar85 & 0x7f800000;
          auVar113._12_4_ = ~uVar86 & 0x7f800000;
          auVar113 = auVar113 | auVar245;
          auVar265._0_4_ = (uint)fVar291 & uVar83;
          auVar265._4_4_ = (uint)fVar294 & uVar84;
          auVar265._8_4_ = (uint)fVar302 & uVar85;
          auVar265._12_4_ = (uint)fVar304 & uVar86;
          auVar257._0_8_ = CONCAT44(~uVar84,~uVar83) & 0xff800000ff800000;
          auVar257._8_4_ = ~uVar85 & 0xff800000;
          auVar257._12_4_ = ~uVar86 & 0xff800000;
          auVar257 = auVar257 | auVar265;
          auVar151._0_8_ = CONCAT44(fStack_1e4,local_1e8) & 0x7fffffff7fffffff;
          auVar151._8_4_ = ABS(fStack_1e0);
          auVar151._12_4_ = ABS(fStack_1dc);
          auVar39._4_4_ = fStack_364;
          auVar39._0_4_ = local_368;
          auVar39._8_4_ = fStack_360;
          auVar39._12_4_ = fStack_35c;
          auVar171 = maxps(auVar39,auVar151);
          fVar291 = auVar171._0_4_ * 1.9073486e-06;
          fVar294 = auVar171._4_4_ * 1.9073486e-06;
          fVar302 = auVar171._8_4_ * 1.9073486e-06;
          fVar304 = auVar171._12_4_ * 1.9073486e-06;
          auVar234._0_4_ = -(uint)(ABS(fVar281) < fVar291 && bVar25);
          auVar234._4_4_ = -(uint)(ABS(fVar261) < fVar294 && bVar26);
          auVar234._8_4_ = -(uint)(ABS(fVar268) < fVar302 && bVar27);
          auVar234._12_4_ = -(uint)(ABS(fVar289) < fVar304 && bVar28);
          iVar65 = movmskps(iVar65,auVar234);
          if (iVar65 != 0) {
            uVar83 = -(uint)(fVar185 <= 0.0);
            uVar84 = -(uint)(fVar238 <= 0.0);
            uVar85 = -(uint)(fVar248 <= 0.0);
            uVar86 = -(uint)(fVar259 <= 0.0);
            auVar277._0_4_ = (uVar83 & 0xff800000 | ~uVar83 & 0x7f800000) & auVar234._0_4_;
            auVar277._4_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar234._4_4_;
            auVar277._8_4_ = (uVar85 & 0xff800000 | ~uVar85 & 0x7f800000) & auVar234._8_4_;
            auVar277._12_4_ = (uVar86 & 0xff800000 | ~uVar86 & 0x7f800000) & auVar234._12_4_;
            auVar266._0_4_ = ~auVar234._0_4_ & auVar113._0_4_;
            auVar266._4_4_ = ~auVar234._4_4_ & auVar113._4_4_;
            auVar266._8_4_ = ~auVar234._8_4_ & auVar113._8_4_;
            auVar266._12_4_ = ~auVar234._12_4_ & auVar113._12_4_;
            auVar278._0_4_ = (uVar83 & 0x7f800000 | ~uVar83 & 0xff800000) & auVar234._0_4_;
            auVar278._4_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar234._4_4_;
            auVar278._8_4_ = (uVar85 & 0x7f800000 | ~uVar85 & 0xff800000) & auVar234._8_4_;
            auVar278._12_4_ = (uVar86 & 0x7f800000 | ~uVar86 & 0xff800000) & auVar234._12_4_;
            auVar235._0_4_ = ~auVar234._0_4_ & auVar257._0_4_;
            auVar235._4_4_ = ~auVar234._4_4_ & auVar257._4_4_;
            auVar235._8_4_ = ~auVar234._8_4_ & auVar257._8_4_;
            auVar235._12_4_ = ~auVar234._12_4_ & auVar257._12_4_;
            local_518._4_4_ = -(uint)((fVar294 <= ABS(fVar261) || fVar238 <= 0.0) && bVar26);
            local_518._0_4_ = -(uint)((fVar291 <= ABS(fVar281) || fVar185 <= 0.0) && bVar25);
            fStack_510 = (float)-(uint)((fVar302 <= ABS(fVar268) || fVar248 <= 0.0) && bVar27);
            fStack_50c = (float)-(uint)((fVar304 <= ABS(fVar289) || fVar259 <= 0.0) && bVar28);
            auVar113 = auVar266 | auVar277;
            auVar257 = auVar235 | auVar278;
          }
        }
        fVar280 = fVar280 * local_558;
        fVar326 = fVar326 * fStack_554;
        fVar267 = fVar267 * fStack_550;
        fVar282 = fVar282 * fStack_54c;
        fVar185 = (float)local_638._0_4_ * local_568;
        fVar238 = (float)local_638._4_4_ * fStack_564;
        fStack_630 = fStack_630 * fStack_560;
        fStack_62c = fStack_62c * fStack_55c;
        _local_138 = local_508;
        local_128 = minps(auVar89,auVar113);
        auVar171 = maxps(local_508,auVar257);
        local_2b8 = auVar171;
        local_2a8 = auVar89;
        auVar258._0_4_ = -(uint)(fVar214 <= local_128._0_4_) & auVar337._0_4_;
        auVar258._4_4_ = -(uint)(fVar240 <= local_128._4_4_) & auVar337._4_4_;
        auVar258._8_4_ = -(uint)(fVar250 <= local_128._8_4_) & auVar337._8_4_;
        auVar258._12_4_ = -(uint)(fVar168 <= local_128._12_4_) & auVar337._12_4_;
        auVar176._0_8_ =
             CONCAT44(-(uint)(auVar171._4_4_ <= auVar89._4_4_) & auVar337._4_4_,
                      -(uint)(auVar171._0_4_ <= auVar89._0_4_) & auVar337._0_4_);
        auVar176._8_4_ = -(uint)(auVar171._8_4_ <= auVar89._8_4_) & auVar337._8_4_;
        auVar176._12_4_ = -(uint)(auVar171._12_4_ <= auVar89._12_4_) & auVar337._12_4_;
        auVar114._8_4_ = auVar176._8_4_;
        auVar114._0_8_ = auVar176._0_8_;
        auVar114._12_4_ = auVar176._12_4_;
        iVar65 = movmskps(iVar65,auVar114 | auVar258);
        if (iVar65 != 0) {
          _local_3e8 = auVar176;
          local_3f8 = fVar128;
          fStack_3f4 = fVar128;
          fStack_3f0 = fVar128;
          fStack_3ec = fVar128;
          local_588._0_4_ =
               -(uint)((int)fVar128 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_588._0_4_ * fVar127 +
                                                 (float)local_678._0_4_ * local_558 +
                                                 local_618 * local_568)) & local_518._0_4_) << 0x1f)
                      >> 0x1f) + 4);
          local_588._4_4_ =
               -(uint)((int)fVar128 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_588._4_4_ * fVar127 +
                                                 (float)local_678._4_4_ * fStack_554 +
                                                 fStack_614 * fStack_564)) & local_518._4_4_) <<
                            0x1f) >> 0x1f) + 4);
          fStack_580 = (float)-(uint)((int)fVar128 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_580 * fVar127 +
                                                                fStack_670 * fStack_550 +
                                                                fStack_610 * fStack_560)) &
                                            (uint)fStack_510) << 0x1f) >> 0x1f) + 4);
          fStack_57c = (float)-(uint)((int)fVar128 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_57c * fVar127 +
                                                                fStack_66c * fStack_54c +
                                                                fStack_60c * fStack_55c)) &
                                            (uint)fStack_50c) << 0x1f) >> 0x1f) + 4);
          _local_3d8 = auVar258;
          local_3a8 = ~_local_588 & auVar258;
          iVar65 = movmskps(iVar65,local_3a8);
          if (iVar65 != 0) {
            local_548 = local_578 + fVar214;
            fStack_544 = fStack_574 + fVar240;
            fStack_540 = fStack_570 + fVar250;
            fStack_53c = fStack_56c + fVar168;
            do {
              auVar274 = ~local_3a8 & _DAT_01f7a9f0 | local_3a8 & local_508;
              auVar197._4_4_ = auVar274._0_4_;
              auVar197._0_4_ = auVar274._4_4_;
              auVar197._8_4_ = auVar274._12_4_;
              auVar197._12_4_ = auVar274._8_4_;
              auVar89 = minps(auVar197,auVar274);
              auVar152._0_8_ = auVar89._8_8_;
              auVar152._8_4_ = auVar89._0_4_;
              auVar152._12_4_ = auVar89._4_4_;
              auVar89 = minps(auVar152,auVar89);
              auVar153._0_8_ =
                   CONCAT44(-(uint)(auVar89._4_4_ == auVar274._4_4_) & local_3a8._4_4_,
                            -(uint)(auVar89._0_4_ == auVar274._0_4_) & local_3a8._0_4_);
              auVar153._8_4_ = -(uint)(auVar89._8_4_ == auVar274._8_4_) & local_3a8._8_4_;
              auVar153._12_4_ = -(uint)(auVar89._12_4_ == auVar274._12_4_) & local_3a8._12_4_;
              iVar65 = movmskps(iVar65,auVar153);
              auVar115 = local_3a8;
              if (iVar65 != 0) {
                auVar115._8_4_ = auVar153._8_4_;
                auVar115._0_8_ = auVar153._0_8_;
                auVar115._12_4_ = auVar153._12_4_;
              }
              uVar66 = movmskps(iVar65,auVar115);
              uVar69 = 0;
              if (CONCAT44(uVar74,uVar66) != 0) {
                for (; (CONCAT44(uVar74,uVar66) >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                }
              }
              *(undefined4 *)(local_3a8 + uVar69 * 4) = 0;
              auVar32._4_4_ = fStack_524;
              auVar32._0_4_ = local_528;
              auVar32._8_4_ = fStack_520;
              auVar32._12_4_ = fStack_51c;
              auVar36._4_4_ = fStack_404;
              auVar36._0_4_ = local_408;
              auVar36._8_4_ = fStack_400;
              auVar36._12_4_ = fStack_3fc;
              auVar274 = minps(auVar32,auVar36);
              auVar243 = maxps(auVar32,auVar36);
              auVar34._4_4_ = fStack_414;
              auVar34._0_4_ = local_418;
              auVar34._8_4_ = fStack_410;
              auVar34._12_4_ = fStack_40c;
              auVar89 = minps(auVar34,auVar319);
              auVar274 = minps(auVar274,auVar89);
              auVar89 = maxps(auVar34,auVar319);
              auVar89 = maxps(auVar243,auVar89);
              auVar177._0_8_ = auVar274._0_8_ & 0x7fffffff7fffffff;
              auVar177._8_4_ = auVar274._8_4_ & 0x7fffffff;
              auVar177._12_4_ = auVar274._12_4_ & 0x7fffffff;
              local_4f8 = auVar89._12_4_;
              auVar116._0_8_ = auVar89._0_8_ & 0x7fffffff7fffffff;
              auVar116._8_4_ = auVar89._8_4_ & 0x7fffffff;
              auVar116._12_4_ = ABS(local_4f8);
              auVar89 = maxps(auVar177,auVar116);
              fVar168 = auVar89._4_4_;
              if (auVar89._4_4_ <= auVar89._0_4_) {
                fVar168 = auVar89._0_4_;
              }
              auVar178._8_8_ = auVar89._8_8_;
              auVar178._0_8_ = auVar89._8_8_;
              if (auVar89._8_4_ <= fVar168) {
                auVar178._0_4_ = fVar168;
              }
              register0x00001284 = auVar178._4_12_;
              local_488._0_4_ = auVar178._0_4_ * 1.9073486e-06;
              fStack_4f4 = local_4f8;
              fStack_4f0 = local_4f8;
              fStack_4ec = local_4f8;
              fVar168 = local_108[uVar69];
              fVar214 = *(float *)(local_138 + uVar69 * 4);
              lVar78 = 5;
              do {
                fVar281 = SQRT(fVar167) * 1.9073486e-06 * fVar214;
                fVar248 = 1.0 - fVar168;
                fVar250 = local_408 * fVar248 + local_418 * fVar168;
                fVar259 = fStack_404 * fVar248 + fStack_414 * fVar168;
                fVar269 = fStack_400 * fVar248 + fStack_410 * fVar168;
                fVar261 = fStack_3fc * fVar248 + fStack_40c * fVar168;
                fVar268 = (local_528 * fVar248 + local_408 * fVar168) * fVar248 + fVar168 * fVar250;
                fVar291 = (fStack_524 * fVar248 + fStack_404 * fVar168) * fVar248 +
                          fVar168 * fVar259;
                fVar294 = (fStack_520 * fVar248 + fStack_400 * fVar168) * fVar248 +
                          fVar168 * fVar269;
                fVar240 = (fStack_51c * fVar248 + fStack_3fc * fVar168) * fVar248 +
                          fVar168 * fVar261;
                fVar304 = fVar250 * fVar248 + (local_418 * fVar248 + fVar204 * fVar168) * fVar168;
                fVar308 = fVar259 * fVar248 + (fStack_414 * fVar248 + fVar205 * fVar168) * fVar168;
                fVar322 = fVar269 * fVar248 + (fStack_410 * fVar248 + fVar206 * fVar168) * fVar168;
                fVar250 = fVar261 * fVar248 + (fStack_40c * fVar248 + fVar169 * fVar168) * fVar168;
                fVar327 = fVar248 * fVar240 + fVar168 * fVar250;
                fVar306 = (fVar304 - fVar268) * 3.0;
                fVar320 = (fVar308 - fVar291) * 3.0;
                fVar324 = (fVar322 - fVar294) * 3.0;
                fVar240 = (fVar250 - fVar240) * 3.0;
                fVar250 = fVar248 * 6.0;
                fVar289 = (fVar168 - (fVar248 + fVar248)) * 6.0;
                fVar302 = (fVar248 - (fVar168 + fVar168)) * 6.0;
                fVar261 = fVar168 * 6.0;
                fVar259 = fVar250 * local_528 +
                          fVar289 * local_408 + fVar302 * local_418 + fVar261 * fVar204;
                fVar269 = fVar250 * fStack_524 +
                          fVar289 * fStack_404 + fVar302 * fStack_414 + fVar261 * fVar205;
                fVar250 = fVar250 * fStack_520 +
                          fVar289 * fStack_400 + fVar302 * fStack_410 + fVar261 * fVar206;
                fVar302 = (fVar214 * fVar186 + 0.0) - (fVar248 * fVar268 + fVar168 * fVar304);
                fVar304 = (fVar214 * fVar126 + 0.0) - (fVar248 * fVar291 + fVar168 * fVar308);
                fVar294 = (fVar214 * fVar127 + 0.0) - (fVar248 * fVar294 + fVar168 * fVar322);
                fStack_48c = (fVar214 * 0.0 + 0.0) - fVar327;
                fVar261 = fVar304 * fVar304;
                fVar268 = fVar294 * fVar294;
                fVar289 = fStack_48c * fStack_48c;
                fVar248 = fVar261 + fVar302 * fVar302 + fVar268;
                fVar291 = fVar261 + fVar261 + fVar289;
                auVar288._4_4_ = fVar291;
                auVar288._0_4_ = fVar248;
                fVar268 = fVar261 + fVar268 + fVar268;
                fVar289 = fVar261 + fVar289 + fVar289;
                local_478 = (float)local_488._0_4_;
                if ((float)local_488._0_4_ <= fVar281) {
                  local_478 = fVar281;
                }
                fVar308 = fVar320 * fVar320 + fVar306 * fVar306 + fVar324 * fVar324;
                auVar89 = ZEXT416((uint)fVar308);
                auVar274 = rsqrtss(ZEXT416((uint)fVar308),auVar89);
                fVar281 = auVar274._0_4_;
                fVar322 = fVar281 * 1.5 - fVar281 * fVar281 * fVar308 * 0.5 * fVar281;
                fVar292 = fVar306 * fVar322;
                fVar293 = fVar320 * fVar322;
                fVar295 = fVar324 * fVar322;
                local_678._4_4_ = fVar240 * fVar322;
                fVar290 = fVar324 * fVar250 + fVar320 * fVar269 + fVar306 * fVar259;
                auVar89 = rcpss(auVar89,auVar89);
                fVar261 = (2.0 - fVar308 * auVar89._0_4_) * auVar89._0_4_;
                fVar281 = fVar304 * fVar293;
                fVar330 = fVar294 * fVar295;
                fVar331 = fStack_48c * (float)local_678._4_4_;
                fVar332 = fVar281 + fVar302 * fVar292 + fVar330;
                fVar283 = fVar281 + fVar281 + fVar331;
                fVar330 = fVar281 + fVar330 + fVar330;
                fVar331 = fVar281 + fVar331 + fVar331;
                fStack_474 = (float)local_488._4_4_;
                fStack_470 = fStack_480;
                fStack_46c = fStack_47c;
                local_538 = (SQRT(fVar248) + 1.0) * ((float)local_488._0_4_ / SQRT(fVar308)) +
                            SQRT(fVar248) * (float)local_488._0_4_ + local_478;
                fVar281 = (float)local_678._4_4_ * 0.0;
                local_678._4_4_ = (float)local_678._4_4_ * -fVar240;
                local_678._0_4_ =
                     fVar295 * -fVar324 + fVar293 * -fVar320 + fVar292 * -fVar306 +
                     fVar261 * (fVar308 * fVar250 - fVar290 * fVar324) * fVar322 * fVar294 +
                     fVar261 * (fVar308 * fVar269 - fVar290 * fVar320) * fVar322 * fVar304 +
                     fVar261 * (fVar308 * fVar259 - fVar290 * fVar306) * fVar322 * fVar302;
                fVar250 = fVar127 * fVar295 + fVar126 * fVar293 + fVar186 * fVar292;
                auVar288._8_4_ = fVar268;
                auVar288._12_4_ = fVar289;
                fVar248 = fVar248 - fVar332 * fVar332;
                auVar279._0_8_ = CONCAT44(fVar291 - fVar283 * fVar283,fVar248);
                auVar279._8_4_ = fVar268 - fVar330 * fVar330;
                auVar279._12_4_ = fVar289 - fVar331 * fVar331;
                fVar268 = -fVar240 * fStack_48c;
                local_498._4_4_ = fVar304;
                local_498._0_4_ = fVar302;
                fStack_490 = fVar294;
                fVar269 = fStack_48c * 0.0;
                fVar259 = (fVar127 * fVar294 + fVar126 * fVar304 + fVar186 * fVar302) -
                          fVar332 * fVar250;
                auVar154._8_4_ = auVar279._8_4_;
                auVar154._0_8_ = auVar279._0_8_;
                auVar154._12_4_ = auVar279._12_4_;
                auVar89 = rsqrtss(auVar154,auVar279);
                fVar261 = auVar89._0_4_;
                auVar198._0_4_ = fVar261 * 1.5 - fVar261 * fVar261 * fVar248 * 0.5 * fVar261;
                auVar198._4_12_ = auVar89._4_12_;
                if (fVar248 < 0.0) {
                  local_4a8._4_4_ = fVar320;
                  local_4a8._0_4_ = fVar306;
                  fStack_4a0 = fVar324;
                  fStack_49c = fVar240;
                  local_4c8._4_4_ = fVar281;
                  local_4c8._0_4_ = fVar250;
                  fStack_4c0 = fVar127 * fVar295;
                  fStack_4bc = fVar281;
                  _local_4e8 = auVar198;
                  local_4d8 = fVar259;
                  fStack_4d4 = fVar269;
                  fStack_4d0 = fVar127 * fVar294;
                  fStack_4cc = fVar269;
                  _local_4b8 = auVar288;
                  fVar248 = sqrtf(fVar248);
                  uVar69 = extraout_RAX;
                  auVar198 = _local_4e8;
                  auVar288 = _local_4b8;
                  fVar250 = (float)local_4c8._0_4_;
                  fVar281 = (float)local_4c8._4_4_;
                  fVar261 = (float)local_4a8._0_4_;
                  fVar289 = (float)local_4a8._4_4_;
                  fVar291 = fStack_4a0;
                  fVar240 = fStack_49c;
                  fVar259 = local_4d8;
                  fVar269 = fStack_4d4;
                }
                else {
                  fVar248 = SQRT(fVar248);
                  fVar261 = fVar306;
                  fVar289 = fVar320;
                  fVar291 = fVar324;
                }
                fVar248 = fVar248 - fVar327;
                fVar294 = ((-fVar324 * fVar294 + -fVar320 * fVar304 + -fVar306 * fVar302) -
                          fVar332 * (float)local_678._0_4_) * auVar198._0_4_ - fVar240;
                fVar259 = fVar259 * auVar198._0_4_;
                auVar199._0_4_ = (float)local_678._0_4_ * fVar259 - fVar250 * fVar294;
                auVar208._8_4_ = -fVar268;
                auVar208._0_8_ = CONCAT44(fVar268,fVar294) ^ 0x8000000000000000;
                auVar208._12_4_ = fVar269;
                auVar207._8_8_ = auVar208._8_8_;
                auVar207._0_8_ = CONCAT44(fVar259,fVar294) ^ 0x80000000;
                auVar199._4_4_ = auVar199._0_4_;
                auVar199._8_4_ = auVar199._0_4_;
                auVar199._12_4_ = auVar199._0_4_;
                auVar89 = divps(auVar207,auVar199);
                auVar237._8_4_ = local_678._4_4_;
                auVar237._0_8_ = local_678;
                auVar237._12_4_ = -fVar281;
                auVar236._8_8_ = auVar237._8_8_;
                auVar236._0_8_ = CONCAT44(fVar250,local_678._0_4_) ^ 0x8000000000000000;
                auVar274 = divps(auVar236,auVar199);
                fVar214 = fVar214 - (fVar248 * auVar274._0_4_ + fVar332 * auVar89._0_4_);
                fVar168 = fVar168 - (fVar248 * auVar274._4_4_ + fVar332 * auVar89._4_4_);
                if ((ABS(fVar332) < local_538) &&
                   (ABS(fVar248) < local_4f8 * 1.9073486e-06 + local_478 + local_538)) {
                  fVar214 = (float)local_3c8._0_4_ + fVar214;
                  if ((fVar88 <= fVar214) &&
                     (((fVar248 = *(float *)(ray + k * 4 + 0x80), fVar214 <= fVar248 &&
                       (0.0 <= fVar168)) && (fVar168 <= 1.0)))) {
                    auVar89 = rsqrtss(auVar288,auVar288);
                    fVar250 = auVar89._0_4_;
                    pGVar22 = (context->scene->geometries).items[(long)pRVar79].ptr;
                    uVar69 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    pRVar75 = pRVar79;
                    if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar269 = fVar250 * 1.5 + fVar250 * fVar250 * auVar288._0_4_ * -0.5 * fVar250;
                      fVar281 = (float)local_498._0_4_ * fVar269;
                      fVar294 = (float)local_498._4_4_ * fVar269;
                      fVar269 = fStack_490 * fVar269;
                      fVar250 = fVar240 * fVar281 + fVar261;
                      fVar259 = fVar240 * fVar294 + fVar289;
                      fVar240 = fVar240 * fVar269 + fVar291;
                      fVar268 = fVar294 * fVar261 - fVar289 * fVar281;
                      fVar289 = fVar269 * fVar289 - fVar291 * fVar294;
                      fVar281 = fVar281 * fVar291 - fVar261 * fVar269;
                      fVar269 = fVar259 * fVar289 - fVar281 * fVar250;
                      fVar259 = fVar240 * fVar281 - fVar268 * fVar259;
                      fVar240 = fVar250 * fVar268 - fVar289 * fVar240;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar214;
                        *(float *)(ray + k * 4 + 0xc0) = fVar259;
                        *(float *)(ray + k * 4 + 0xd0) = fVar240;
                        *(float *)(ray + k * 4 + 0xe0) = fVar269;
                        *(float *)(ray + k * 4 + 0xf0) = fVar168;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_460;
                        *(uint *)(ray + k * 4 + 0x120) = uVar82;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar83 = context->user->instPrimID[0];
                        uVar69 = (ulong)uVar83;
                        *(uint *)(ray + k * 4 + 0x140) = uVar83;
                        pRVar75 = (RTCIntersectArguments *)context;
                      }
                      else {
                        local_348._4_4_ = fVar259;
                        local_348._0_4_ = fVar259;
                        local_348._8_4_ = fVar259;
                        fStack_33c = fVar259;
                        local_338 = fVar240;
                        fStack_334 = fVar240;
                        fStack_330 = fVar240;
                        fStack_32c = fVar240;
                        local_328 = fVar269;
                        fStack_324 = fVar269;
                        fStack_320 = fVar269;
                        fStack_31c = fVar269;
                        local_318 = fVar168;
                        fStack_314 = fVar168;
                        fStack_310 = fVar168;
                        fStack_30c = fVar168;
                        local_308 = 0;
                        uStack_300 = 0;
                        local_2f8 = CONCAT44(uStack_384,local_388);
                        uStack_2f0 = CONCAT44(uStack_37c,uStack_380);
                        local_2e8 = CONCAT44(uStack_374,local_378);
                        uStack_2e0 = CONCAT44(uStack_36c,uStack_370);
                        local_2d8 = context->user->instID[0];
                        uStack_2d4 = local_2d8;
                        uStack_2d0 = local_2d8;
                        uStack_2cc = local_2d8;
                        local_2c8 = context->user->instPrimID[0];
                        uStack_2c4 = local_2c8;
                        uStack_2c0 = local_2c8;
                        uStack_2bc = local_2c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar214;
                        local_5c8 = *local_468;
                        _local_5b8 = (int *)local_5c8;
                        uStack_5b0 = pGVar22->userPtr;
                        local_5a8 = context->user;
                        local_5a0 = ray;
                        local_598 = (RTCIntersectArguments *)local_348;
                        local_590 = 4;
                        p_Var72 = pGVar22->intersectionFilterN;
                        pRVar75 = (RTCIntersectArguments *)context;
                        if (p_Var72 != (RTCFilterFunctionN)0x0) {
                          p_Var72 = (RTCFilterFunctionN)
                                    (*p_Var72)((RTCFilterFunctionNArguments *)local_5b8);
                        }
                        auVar155._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                        auVar155._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                        auVar155._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                        auVar155._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                        uVar83 = movmskps((int)p_Var72,auVar155);
                        pRVar70 = (RayHitK<4> *)(ulong)(uVar83 ^ 0xf);
                        if ((uVar83 ^ 0xf) == 0) {
                          auVar155 = auVar155 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar75 = context->args;
                          pRVar73 = (RTCIntersectArguments *)pRVar75->filter;
                          if ((pRVar73 != (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar75->flags & 2) != 0 ||
                              (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar73 = (RTCIntersectArguments *)(*(code *)pRVar73)(local_5b8);
                          }
                          auVar117._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                          auVar117._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                          auVar117._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                          auVar117._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                          auVar155 = auVar117 ^ _DAT_01f7ae20;
                          uVar83 = movmskps((int)pRVar73,auVar117);
                          pRVar70 = (RayHitK<4> *)(ulong)(uVar83 ^ 0xf);
                          if ((uVar83 ^ 0xf) != 0) {
                            RVar29 = local_598->feature_mask;
                            uVar83 = *(uint *)&local_598->context;
                            uVar84 = *(uint *)((long)&local_598->context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0xc0) =
                                 ~auVar117._0_4_ & local_598->flags |
                                 *(uint *)(local_5a0 + 0xc0) & auVar117._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xc4) =
                                 ~auVar117._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xc4) & auVar117._4_4_;
                            *(uint *)(local_5a0 + 200) =
                                 ~auVar117._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 200) & auVar117._8_4_;
                            *(uint *)(local_5a0 + 0xcc) =
                                 ~auVar117._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xcc) & auVar117._12_4_;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598->filter + 4);
                            uVar83 = *(uint *)&local_598->intersect;
                            uVar84 = *(uint *)((long)&local_598->intersect + 4);
                            *(uint *)(local_5a0 + 0xd0) =
                                 ~auVar117._0_4_ & *(uint *)&local_598->filter |
                                 *(uint *)(local_5a0 + 0xd0) & auVar117._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xd4) =
                                 ~auVar117._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xd4) & auVar117._4_4_;
                            *(uint *)(local_5a0 + 0xd8) =
                                 ~auVar117._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0xd8) & auVar117._8_4_;
                            *(uint *)(local_5a0 + 0xdc) =
                                 ~auVar117._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xdc) & auVar117._12_4_;
                            RVar29 = local_598[1].feature_mask;
                            uVar83 = *(uint *)&local_598[1].context;
                            uVar84 = *(uint *)((long)&local_598[1].context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0xe0) =
                                 ~auVar117._0_4_ & local_598[1].flags |
                                 *(uint *)(local_5a0 + 0xe0) & auVar117._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xe4) =
                                 ~auVar117._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xe4) & auVar117._4_4_;
                            *(uint *)(local_5a0 + 0xe8) =
                                 ~auVar117._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0xe8) & auVar117._8_4_;
                            *(uint *)(local_5a0 + 0xec) =
                                 ~auVar117._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xec) & auVar117._12_4_;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598[1].filter + 4);
                            uVar83 = *(uint *)&local_598[1].intersect;
                            uVar84 = *(uint *)((long)&local_598[1].intersect + 4);
                            *(uint *)(local_5a0 + 0xf0) =
                                 ~auVar117._0_4_ & *(uint *)&local_598[1].filter |
                                 *(uint *)(local_5a0 + 0xf0) & auVar117._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xf4) =
                                 ~auVar117._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xf4) & auVar117._4_4_;
                            *(uint *)(local_5a0 + 0xf8) =
                                 ~auVar117._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0xf8) & auVar117._8_4_;
                            *(uint *)(local_5a0 + 0xfc) =
                                 ~auVar117._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xfc) & auVar117._12_4_;
                            RVar29 = local_598[2].feature_mask;
                            uVar83 = *(uint *)&local_598[2].context;
                            uVar84 = *(uint *)((long)&local_598[2].context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0x100) =
                                 ~auVar117._0_4_ & local_598[2].flags |
                                 *(uint *)(local_5a0 + 0x100) & auVar117._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0x104) =
                                 ~auVar117._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0x104) & auVar117._4_4_;
                            *(uint *)(local_5a0 + 0x108) =
                                 ~auVar117._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0x108) & auVar117._8_4_;
                            *(uint *)(local_5a0 + 0x10c) =
                                 ~auVar117._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0x10c) & auVar117._12_4_;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598[2].filter + 4);
                            uVar83 = *(uint *)&local_598[2].intersect;
                            uVar84 = *(uint *)((long)&local_598[2].intersect + 4);
                            *(uint *)(local_5a0 + 0x110) =
                                 *(uint *)(local_5a0 + 0x110) & auVar117._0_4_ |
                                 ~auVar117._0_4_ & *(uint *)&local_598[2].filter;
                            *(RTCFeatureFlags *)(local_5a0 + 0x114) =
                                 *(RTCFeatureFlags *)(local_5a0 + 0x114) & auVar117._4_4_ |
                                 ~auVar117._4_4_ & RVar29;
                            *(uint *)(local_5a0 + 0x118) =
                                 *(uint *)(local_5a0 + 0x118) & auVar117._8_4_ |
                                 ~auVar117._8_4_ & uVar83;
                            *(uint *)(local_5a0 + 0x11c) =
                                 *(uint *)(local_5a0 + 0x11c) & auVar117._12_4_ |
                                 ~auVar117._12_4_ & uVar84;
                            RVar29 = local_598[3].feature_mask;
                            uVar83 = *(uint *)&local_598[3].context;
                            uVar84 = *(uint *)((long)&local_598[3].context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0x120) =
                                 *(uint *)(local_5a0 + 0x120) & auVar117._0_4_ |
                                 ~auVar117._0_4_ & local_598[3].flags;
                            *(RTCFeatureFlags *)(local_5a0 + 0x124) =
                                 *(RTCFeatureFlags *)(local_5a0 + 0x124) & auVar117._4_4_ |
                                 ~auVar117._4_4_ & RVar29;
                            *(uint *)(local_5a0 + 0x128) =
                                 *(uint *)(local_5a0 + 0x128) & auVar117._8_4_ |
                                 ~auVar117._8_4_ & uVar83;
                            *(uint *)(local_5a0 + 300) =
                                 *(uint *)(local_5a0 + 300) & auVar117._12_4_ |
                                 ~auVar117._12_4_ & uVar84;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598[3].filter + 4);
                            uVar83 = *(uint *)&local_598[3].intersect;
                            uVar84 = *(uint *)((long)&local_598[3].intersect + 4);
                            *(uint *)(local_5a0 + 0x130) =
                                 ~auVar117._0_4_ & *(uint *)&local_598[3].filter |
                                 *(uint *)(local_5a0 + 0x130) & auVar117._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0x134) =
                                 ~auVar117._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0x134) & auVar117._4_4_;
                            *(uint *)(local_5a0 + 0x138) =
                                 ~auVar117._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0x138) & auVar117._8_4_;
                            *(uint *)(local_5a0 + 0x13c) =
                                 ~auVar117._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0x13c) & auVar117._12_4_;
                            auVar19._0_4_ = local_598[4].flags;
                            auVar19._4_4_ = local_598[4].feature_mask;
                            auVar19._8_8_ = local_598[4].context;
                            *(undefined1 (*) [16])(local_5a0 + 0x140) =
                                 ~auVar117 & auVar19 |
                                 *(undefined1 (*) [16])(local_5a0 + 0x140) & auVar117;
                            pRVar70 = local_5a0;
                            pRVar75 = local_598;
                          }
                        }
                        auVar156._0_4_ = auVar155._0_4_ << 0x1f;
                        auVar156._4_4_ = auVar155._4_4_ << 0x1f;
                        auVar156._8_4_ = auVar155._8_4_ << 0x1f;
                        auVar156._12_4_ = auVar155._12_4_ << 0x1f;
                        iVar65 = movmskps((int)pRVar70,auVar156);
                        uVar69 = CONCAT44((int)((ulong)pRVar70 >> 0x20),iVar65);
                        if (iVar65 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar248;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar78 = lVar78 + -1;
              } while (lVar78 != 0);
              fVar269 = *(float *)(ray + k * 4 + 0x80);
              local_3a8._0_4_ = -(uint)(local_548 <= fVar269) & local_3a8._0_4_;
              local_3a8._4_4_ = -(uint)(fStack_544 <= fVar269) & local_3a8._4_4_;
              local_3a8._8_4_ = -(uint)(fStack_540 <= fVar269) & local_3a8._8_4_;
              local_3a8._12_4_ = -(uint)(fStack_53c <= fVar269) & local_3a8._12_4_;
              uVar74 = (undefined4)(uVar69 >> 0x20);
              iVar65 = movmskps((int)uVar69,local_3a8);
            } while (iVar65 != 0);
          }
          uVar66 = SUB84(pRVar75,0);
          auVar158._0_4_ = -(uint)(auVar171._0_4_ + local_578 <= fVar269) & local_3e8._0_4_;
          auVar158._4_4_ = -(uint)(auVar171._4_4_ + fStack_574 <= fVar269) & local_3e8._4_4_;
          auVar158._8_4_ = -(uint)(auVar171._8_4_ + fStack_570 <= fVar269) & (uint)fStack_3e0;
          auVar158._12_4_ = -(uint)(auVar171._12_4_ + fStack_56c <= fVar269) & (uint)fStack_3dc;
          auVar181._0_4_ =
               -(uint)((int)local_3f8 <
                      ((int)((-(uint)(0.3 <= ABS(fVar185 + fVar280 + fVar187 * fVar127)) &
                             local_518._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar181._4_4_ =
               -(uint)((int)fStack_3f4 <
                      ((int)((-(uint)(0.3 <= ABS(fVar238 + fVar326 + fVar239 * fVar127)) &
                             local_518._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar181._8_4_ =
               -(uint)((int)fStack_3f0 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_630 + fVar267 + fVar249 * fVar127)) &
                             (uint)fStack_510) << 0x1f) >> 0x1f) + 4);
          auVar181._12_4_ =
               -(uint)((int)fStack_3ec <
                      ((int)((-(uint)(0.3 <= ABS(fStack_62c + fVar282 + fVar260 * fVar127)) &
                             (uint)fStack_50c) << 0x1f) >> 0x1f) + 4);
          local_3b8 = ~auVar181 & auVar158;
          iVar65 = movmskps(0,local_3b8);
          if (iVar65 != 0) {
            local_548 = local_578 + local_2b8._0_4_;
            fStack_544 = fStack_574 + local_2b8._4_4_;
            fStack_540 = fStack_570 + local_2b8._8_4_;
            fStack_53c = fStack_56c + local_2b8._12_4_;
            local_508 = local_2b8;
            do {
              uVar83 = local_3b8._0_4_;
              uVar84 = local_3b8._4_4_;
              uVar85 = local_3b8._8_4_;
              uVar86 = local_3b8._12_4_;
              auVar159._0_4_ = uVar83 & local_508._0_4_;
              auVar159._4_4_ = uVar84 & local_508._4_4_;
              auVar159._8_4_ = uVar85 & local_508._8_4_;
              auVar159._12_4_ = uVar86 & local_508._12_4_;
              auVar182._0_8_ = CONCAT44(~uVar84,~uVar83) & 0x7f8000007f800000;
              auVar182._8_4_ = ~uVar85 & 0x7f800000;
              auVar182._12_4_ = ~uVar86 & 0x7f800000;
              auVar182 = auVar182 | auVar159;
              auVar201._4_4_ = auVar182._0_4_;
              auVar201._0_4_ = auVar182._4_4_;
              auVar201._8_4_ = auVar182._12_4_;
              auVar201._12_4_ = auVar182._8_4_;
              auVar89 = minps(auVar201,auVar182);
              auVar160._0_8_ = auVar89._8_8_;
              auVar160._8_4_ = auVar89._0_4_;
              auVar160._12_4_ = auVar89._4_4_;
              auVar89 = minps(auVar160,auVar89);
              auVar161._0_8_ =
                   CONCAT44(-(uint)(auVar89._4_4_ == auVar182._4_4_) & uVar84,
                            -(uint)(auVar89._0_4_ == auVar182._0_4_) & uVar83);
              auVar161._8_4_ = -(uint)(auVar89._8_4_ == auVar182._8_4_) & uVar85;
              auVar161._12_4_ = -(uint)(auVar89._12_4_ == auVar182._12_4_) & uVar86;
              iVar65 = movmskps(iVar65,auVar161);
              auVar120 = local_3b8;
              if (iVar65 != 0) {
                auVar120._8_4_ = auVar161._8_4_;
                auVar120._0_8_ = auVar161._0_8_;
                auVar120._12_4_ = auVar161._12_4_;
              }
              uVar66 = movmskps(iVar65,auVar120);
              uVar69 = 0;
              if (CONCAT44(uVar74,uVar66) != 0) {
                for (; (CONCAT44(uVar74,uVar66) >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                }
              }
              *(undefined4 *)(local_3b8 + uVar69 * 4) = 0;
              auVar33._4_4_ = fStack_524;
              auVar33._0_4_ = local_528;
              auVar33._8_4_ = fStack_520;
              auVar33._12_4_ = fStack_51c;
              auVar37._4_4_ = fStack_404;
              auVar37._0_4_ = local_408;
              auVar37._8_4_ = fStack_400;
              auVar37._12_4_ = fStack_3fc;
              auVar171 = minps(auVar33,auVar37);
              auVar274 = maxps(auVar33,auVar37);
              auVar35._4_4_ = fStack_414;
              auVar35._0_4_ = local_418;
              auVar35._8_4_ = fStack_410;
              auVar35._12_4_ = fStack_40c;
              auVar89 = minps(auVar35,auVar319);
              auVar171 = minps(auVar171,auVar89);
              auVar89 = maxps(auVar35,auVar319);
              auVar89 = maxps(auVar274,auVar89);
              auVar183._0_8_ = auVar171._0_8_ & 0x7fffffff7fffffff;
              auVar183._8_4_ = auVar171._8_4_ & 0x7fffffff;
              auVar183._12_4_ = auVar171._12_4_ & 0x7fffffff;
              local_4f8 = auVar89._12_4_;
              auVar121._0_8_ = auVar89._0_8_ & 0x7fffffff7fffffff;
              auVar121._8_4_ = auVar89._8_4_ & 0x7fffffff;
              auVar121._12_4_ = ABS(local_4f8);
              auVar89 = maxps(auVar183,auVar121);
              fVar168 = auVar89._4_4_;
              if (auVar89._4_4_ <= auVar89._0_4_) {
                fVar168 = auVar89._0_4_;
              }
              auVar184._8_8_ = auVar89._8_8_;
              auVar184._0_8_ = auVar89._8_8_;
              if (auVar89._8_4_ <= fVar168) {
                auVar184._0_4_ = fVar168;
              }
              fVar187 = auVar184._0_4_ * 1.9073486e-06;
              fStack_4f4 = local_4f8;
              fStack_4f0 = local_4f8;
              fStack_4ec = local_4f8;
              fVar168 = local_118[uVar69];
              fVar185 = *(float *)(local_2a8 + uVar69 * 4);
              lVar78 = 5;
              do {
                fVar239 = SQRT(fVar167) * 1.9073486e-06 * fVar185;
                fVar260 = 1.0 - fVar168;
                fVar238 = local_408 * fVar260 + local_418 * fVar168;
                fVar248 = fStack_404 * fVar260 + fStack_414 * fVar168;
                fVar259 = fStack_400 * fVar260 + fStack_410 * fVar168;
                fVar269 = fStack_3fc * fVar260 + fStack_40c * fVar168;
                fVar240 = (local_528 * fVar260 + local_408 * fVar168) * fVar260 + fVar168 * fVar238;
                fVar249 = (fStack_524 * fVar260 + fStack_404 * fVar168) * fVar260 +
                          fVar168 * fVar248;
                fVar250 = (fStack_520 * fVar260 + fStack_400 * fVar168) * fVar260 +
                          fVar168 * fVar259;
                fVar214 = (fStack_51c * fVar260 + fStack_3fc * fVar168) * fVar260 +
                          fVar168 * fVar269;
                fVar326 = fVar238 * fVar260 +
                          (local_418 * fVar260 + auVar319._0_4_ * fVar168) * fVar168;
                fVar267 = fVar248 * fVar260 +
                          (fStack_414 * fVar260 + auVar319._4_4_ * fVar168) * fVar168;
                fVar282 = fVar259 * fVar260 +
                          (fStack_410 * fVar260 + auVar319._8_4_ * fVar168) * fVar168;
                fVar248 = fVar269 * fVar260 +
                          (fStack_40c * fVar260 + auVar319._12_4_ * fVar168) * fVar168;
                fVar238 = fVar260 * fVar214 + fVar168 * fVar248;
                fVar261 = (fVar326 - fVar240) * 3.0;
                fVar268 = (fVar267 - fVar249) * 3.0;
                fVar289 = (fVar282 - fVar250) * 3.0;
                fStack_52c = (fVar248 - fVar214) * 3.0;
                fVar269 = fVar260 * 6.0;
                fVar248 = (fVar168 - (fVar260 + fVar260)) * 6.0;
                fVar259 = (fVar260 - (fVar168 + fVar168)) * 6.0;
                fVar214 = fVar168 * 6.0;
                fVar280 = fVar269 * local_528 +
                          fVar248 * local_408 + fVar259 * local_418 + fVar214 * auVar319._0_4_;
                fVar281 = fVar269 * fStack_524 +
                          fVar248 * fStack_404 + fVar259 * fStack_414 + fVar214 * auVar319._4_4_;
                fVar248 = fVar269 * fStack_520 +
                          fVar248 * fStack_400 + fVar259 * fStack_410 + fVar214 * auVar319._8_4_;
                fVar240 = (fVar185 * fVar186 + 0.0) - (fVar260 * fVar240 + fVar168 * fVar326);
                fVar249 = (fVar185 * fVar126 + 0.0) - (fVar260 * fVar249 + fVar168 * fVar267);
                fVar250 = (fVar185 * fVar127 + 0.0) - (fVar260 * fVar250 + fVar168 * fVar282);
                fStack_4ac = (fVar185 * 0.0 + 0.0) - fVar238;
                fVar214 = fVar249 * fVar249;
                fStack_4a0 = fVar250 * fVar250;
                fStack_49c = fStack_4ac * fStack_4ac;
                local_4a8._0_4_ = fVar214 + fVar240 * fVar240 + fStack_4a0;
                local_4a8._4_4_ = fVar214 + fVar214 + fStack_49c;
                fStack_4a0 = fVar214 + fStack_4a0 + fStack_4a0;
                fStack_49c = fVar214 + fStack_49c + fStack_49c;
                fVar214 = fVar187;
                if (fVar187 <= fVar239) {
                  fVar214 = fVar239;
                }
                auVar318._4_12_ = auVar184._4_12_;
                auVar318._0_4_ = fVar214;
                fVar259 = fVar268 * fVar268 + fVar261 * fVar261 + fVar289 * fVar289;
                auVar89 = ZEXT416((uint)fVar259);
                auVar171 = rsqrtss(ZEXT416((uint)fVar259),auVar89);
                fVar239 = auVar171._0_4_;
                fVar260 = fVar239 * 1.5 - fVar239 * fVar239 * fVar259 * 0.5 * fVar239;
                fVar282 = fVar261 * fVar260;
                fVar291 = fVar268 * fVar260;
                fVar294 = fVar289 * fVar260;
                fVar302 = fStack_52c * fVar260;
                fVar267 = fVar289 * fVar248 + fVar268 * fVar281 + fVar261 * fVar280;
                local_538 = fVar261;
                fStack_534 = fVar268;
                fStack_530 = fVar289;
                auVar89 = rcpss(auVar89,auVar89);
                fVar239 = (2.0 - fVar259 * auVar89._0_4_) * auVar89._0_4_;
                fVar269 = fVar249 * fVar291;
                fStack_480 = fVar250 * fVar294;
                fStack_47c = fStack_4ac * fVar302;
                fVar326 = fVar269 + fVar240 * fVar282 + fStack_480;
                local_488._4_4_ = fVar269 + fVar269 + fStack_47c;
                fStack_480 = fVar269 + fStack_480 + fStack_480;
                fStack_47c = fVar269 + fStack_47c + fStack_47c;
                fVar269 = (SQRT((float)local_4a8._0_4_) + 1.0) * (fVar187 / SQRT(fVar259)) +
                          SQRT((float)local_4a8._0_4_) * fVar187 + fVar214;
                fStack_470 = fVar294 * -fVar289;
                fStack_474 = fVar302 * -fStack_52c;
                fVar260 = fStack_470 + fVar291 * -fVar268 + fVar282 * -fVar261 +
                          fVar239 * (fVar259 * fVar248 - fVar267 * fVar289) * fVar260 * fVar250 +
                          fVar239 * (fVar259 * fVar281 - fVar267 * fVar268) * fVar260 * fVar249 +
                          fVar239 * (fVar259 * fVar280 - fVar267 * fVar261) * fVar260 * fVar240;
                local_498._0_4_ = fVar127 * fVar294 + fVar126 * fVar291 + fVar186 * fVar282;
                fVar248 = (float)local_4a8._0_4_ - fVar326 * fVar326;
                auVar122._0_8_ =
                     CONCAT44((float)local_4a8._4_4_ -
                              (float)local_488._4_4_ * (float)local_488._4_4_,fVar248);
                auVar122._8_4_ = fStack_4a0 - fStack_480 * fStack_480;
                auVar122._12_4_ = fStack_49c - fStack_47c * fStack_47c;
                fVar280 = -fStack_52c * fStack_4ac;
                local_478 = fVar260;
                fStack_46c = fStack_474;
                local_4b8._4_4_ = fVar249;
                local_4b8._0_4_ = fVar240;
                fStack_4b0 = fVar250;
                fVar239 = fStack_4ac * 0.0;
                local_488._0_4_ = fVar326;
                local_498._4_4_ = fVar302 * 0.0;
                fStack_490 = fVar127 * fVar294;
                fStack_48c = fVar302 * 0.0;
                fVar214 = (fVar127 * fVar250 + fVar126 * fVar249 + fVar186 * fVar240) -
                          fVar326 * (float)local_498._0_4_;
                auVar162._8_4_ = auVar122._8_4_;
                auVar162._0_8_ = auVar122._0_8_;
                auVar162._12_4_ = auVar122._12_4_;
                auVar89 = rsqrtss(auVar162,auVar122);
                fVar259 = auVar89._0_4_;
                auVar202._0_4_ = fVar259 * 1.5 - fVar259 * fVar259 * fVar248 * 0.5 * fVar259;
                auVar202._4_12_ = auVar89._4_12_;
                if (fVar248 < 0.0) {
                  _local_4e8 = auVar202;
                  local_4d8 = fVar214;
                  fStack_4d4 = fVar239;
                  fStack_4d0 = fVar127 * fVar250;
                  fStack_4cc = fVar239;
                  _local_4c8 = auVar318;
                  fVar248 = sqrtf(fVar248);
                  uVar69 = extraout_RAX_00;
                  auVar202 = _local_4e8;
                  auVar318 = _local_4c8;
                  fVar214 = local_4d8;
                  fVar239 = fStack_4d4;
                }
                else {
                  fVar248 = SQRT(fVar248);
                }
                fVar248 = fVar248 - fVar238;
                fVar238 = ((-fVar289 * fVar250 + -fVar268 * fVar249 + -fVar261 * fVar240) -
                          fVar326 * fVar260) * auVar202._0_4_ - fStack_52c;
                fVar214 = fVar214 * auVar202._0_4_;
                auVar247._4_4_ = fStack_474;
                auVar247._0_4_ = local_478;
                auVar203._0_4_ = local_478 * fVar214 - (float)local_498._0_4_ * fVar238;
                auVar210._8_4_ = -fVar280;
                auVar210._0_8_ = CONCAT44(fVar280,fVar238) ^ 0x8000000000000000;
                auVar210._12_4_ = fVar239;
                auVar209._8_8_ = auVar210._8_8_;
                auVar209._0_8_ = CONCAT44(fVar214,fVar238) ^ 0x80000000;
                auVar203._4_4_ = auVar203._0_4_;
                auVar203._8_4_ = auVar203._0_4_;
                auVar203._12_4_ = auVar203._0_4_;
                auVar89 = divps(auVar209,auVar203);
                auVar247._8_4_ = fStack_474;
                auVar247._12_4_ = local_498._4_4_ ^ 0x80000000;
                auVar246._8_8_ = auVar247._8_8_;
                auVar246._0_8_ = CONCAT44(local_498._0_4_,local_478) ^ 0x8000000000000000;
                auVar171 = divps(auVar246,auVar203);
                fVar185 = fVar185 - (fVar248 * auVar171._0_4_ +
                                    (float)local_488._0_4_ * auVar89._0_4_);
                fVar168 = fVar168 - (fVar248 * auVar171._4_4_ +
                                    (float)local_488._0_4_ * auVar89._4_4_);
                if ((ABS((float)local_488._0_4_) < fVar269) &&
                   (ABS(fVar248) < local_4f8 * 1.9073486e-06 + auVar318._0_4_ + fVar269)) {
                  fVar185 = (float)local_3c8._0_4_ + fVar185;
                  if ((fVar88 <= fVar185) &&
                     (((fVar187 = *(float *)(ray + k * 4 + 0x80), fVar185 <= fVar187 &&
                       (0.0 <= fVar168)) && (fVar168 <= 1.0)))) {
                    auVar89 = rsqrtss(_local_4a8,_local_4a8);
                    fVar214 = auVar89._0_4_;
                    pGVar22 = (context->scene->geometries).items[(long)pRVar79].ptr;
                    uVar69 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    pRVar75 = pRVar79;
                    if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar240 = fVar214 * 1.5 + fVar214 * fVar214 * local_4a8._0_4_ * -0.5 * fVar214
                      ;
                      fVar248 = (float)local_4b8._0_4_ * fVar240;
                      fVar250 = (float)local_4b8._4_4_ * fVar240;
                      fVar240 = fStack_4b0 * fVar240;
                      fVar214 = fStack_52c * fVar248 + local_538;
                      fVar238 = fStack_52c * fVar250 + fStack_534;
                      fVar239 = fStack_52c * fVar240 + fStack_530;
                      fVar249 = fVar250 * local_538 - fStack_534 * fVar248;
                      fVar250 = fVar240 * fStack_534 - fStack_530 * fVar250;
                      fVar248 = fVar248 * fStack_530 - local_538 * fVar240;
                      fVar240 = fVar238 * fVar250 - fVar248 * fVar214;
                      fVar238 = fVar239 * fVar248 - fVar249 * fVar238;
                      fVar214 = fVar214 * fVar249 - fVar250 * fVar239;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar185;
                        *(float *)(ray + k * 4 + 0xc0) = fVar238;
                        *(float *)(ray + k * 4 + 0xd0) = fVar214;
                        *(float *)(ray + k * 4 + 0xe0) = fVar240;
                        *(float *)(ray + k * 4 + 0xf0) = fVar168;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_460;
                        *(uint *)(ray + k * 4 + 0x120) = uVar82;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar83 = context->user->instPrimID[0];
                        uVar69 = (ulong)uVar83;
                        *(uint *)(ray + k * 4 + 0x140) = uVar83;
                        pRVar75 = (RTCIntersectArguments *)context;
                      }
                      else {
                        local_348._4_4_ = fVar238;
                        local_348._0_4_ = fVar238;
                        local_348._8_4_ = fVar238;
                        fStack_33c = fVar238;
                        local_338 = fVar214;
                        fStack_334 = fVar214;
                        fStack_330 = fVar214;
                        fStack_32c = fVar214;
                        local_328 = fVar240;
                        fStack_324 = fVar240;
                        fStack_320 = fVar240;
                        fStack_31c = fVar240;
                        local_318 = fVar168;
                        fStack_314 = fVar168;
                        fStack_310 = fVar168;
                        fStack_30c = fVar168;
                        local_308 = 0;
                        uStack_300 = 0;
                        local_2f8 = CONCAT44(uStack_384,local_388);
                        uStack_2f0 = CONCAT44(uStack_37c,uStack_380);
                        local_2e8 = CONCAT44(uStack_374,local_378);
                        uStack_2e0 = CONCAT44(uStack_36c,uStack_370);
                        local_2d8 = context->user->instID[0];
                        uStack_2d4 = local_2d8;
                        uStack_2d0 = local_2d8;
                        uStack_2cc = local_2d8;
                        local_2c8 = context->user->instPrimID[0];
                        uStack_2c4 = local_2c8;
                        uStack_2c0 = local_2c8;
                        uStack_2bc = local_2c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar185;
                        local_5c8 = *local_468;
                        _local_5b8 = (int *)local_5c8;
                        uStack_5b0 = pGVar22->userPtr;
                        local_5a8 = context->user;
                        local_5a0 = ray;
                        local_598 = (RTCIntersectArguments *)local_348;
                        local_590 = 4;
                        p_Var72 = pGVar22->intersectionFilterN;
                        pRVar75 = (RTCIntersectArguments *)context;
                        if (p_Var72 != (RTCFilterFunctionN)0x0) {
                          p_Var72 = (RTCFilterFunctionN)
                                    (*p_Var72)((RTCFilterFunctionNArguments *)local_5b8);
                        }
                        auVar163._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                        auVar163._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                        auVar163._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                        auVar163._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                        uVar83 = movmskps((int)p_Var72,auVar163);
                        pRVar70 = (RayHitK<4> *)(ulong)(uVar83 ^ 0xf);
                        if ((uVar83 ^ 0xf) == 0) {
                          auVar163 = auVar163 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar75 = context->args;
                          pRVar73 = (RTCIntersectArguments *)pRVar75->filter;
                          if ((pRVar73 != (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar75->flags & 2) != 0 ||
                              (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar73 = (RTCIntersectArguments *)(*(code *)pRVar73)(local_5b8);
                          }
                          auVar123._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                          auVar123._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                          auVar123._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                          auVar123._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                          auVar163 = auVar123 ^ _DAT_01f7ae20;
                          uVar83 = movmskps((int)pRVar73,auVar123);
                          pRVar70 = (RayHitK<4> *)(ulong)(uVar83 ^ 0xf);
                          if ((uVar83 ^ 0xf) != 0) {
                            RVar29 = local_598->feature_mask;
                            uVar83 = *(uint *)&local_598->context;
                            uVar84 = *(uint *)((long)&local_598->context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0xc0) =
                                 ~auVar123._0_4_ & local_598->flags |
                                 *(uint *)(local_5a0 + 0xc0) & auVar123._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xc4) =
                                 ~auVar123._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xc4) & auVar123._4_4_;
                            *(uint *)(local_5a0 + 200) =
                                 ~auVar123._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 200) & auVar123._8_4_;
                            *(uint *)(local_5a0 + 0xcc) =
                                 ~auVar123._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xcc) & auVar123._12_4_;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598->filter + 4);
                            uVar83 = *(uint *)&local_598->intersect;
                            uVar84 = *(uint *)((long)&local_598->intersect + 4);
                            *(uint *)(local_5a0 + 0xd0) =
                                 ~auVar123._0_4_ & *(uint *)&local_598->filter |
                                 *(uint *)(local_5a0 + 0xd0) & auVar123._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xd4) =
                                 ~auVar123._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xd4) & auVar123._4_4_;
                            *(uint *)(local_5a0 + 0xd8) =
                                 ~auVar123._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0xd8) & auVar123._8_4_;
                            *(uint *)(local_5a0 + 0xdc) =
                                 ~auVar123._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xdc) & auVar123._12_4_;
                            RVar29 = local_598[1].feature_mask;
                            uVar83 = *(uint *)&local_598[1].context;
                            uVar84 = *(uint *)((long)&local_598[1].context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0xe0) =
                                 ~auVar123._0_4_ & local_598[1].flags |
                                 *(uint *)(local_5a0 + 0xe0) & auVar123._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xe4) =
                                 ~auVar123._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xe4) & auVar123._4_4_;
                            *(uint *)(local_5a0 + 0xe8) =
                                 ~auVar123._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0xe8) & auVar123._8_4_;
                            *(uint *)(local_5a0 + 0xec) =
                                 ~auVar123._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xec) & auVar123._12_4_;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598[1].filter + 4);
                            uVar83 = *(uint *)&local_598[1].intersect;
                            uVar84 = *(uint *)((long)&local_598[1].intersect + 4);
                            *(uint *)(local_5a0 + 0xf0) =
                                 ~auVar123._0_4_ & *(uint *)&local_598[1].filter |
                                 *(uint *)(local_5a0 + 0xf0) & auVar123._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0xf4) =
                                 ~auVar123._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0xf4) & auVar123._4_4_;
                            *(uint *)(local_5a0 + 0xf8) =
                                 ~auVar123._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0xf8) & auVar123._8_4_;
                            *(uint *)(local_5a0 + 0xfc) =
                                 ~auVar123._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0xfc) & auVar123._12_4_;
                            RVar29 = local_598[2].feature_mask;
                            uVar83 = *(uint *)&local_598[2].context;
                            uVar84 = *(uint *)((long)&local_598[2].context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0x100) =
                                 ~auVar123._0_4_ & local_598[2].flags |
                                 *(uint *)(local_5a0 + 0x100) & auVar123._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0x104) =
                                 ~auVar123._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0x104) & auVar123._4_4_;
                            *(uint *)(local_5a0 + 0x108) =
                                 ~auVar123._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0x108) & auVar123._8_4_;
                            *(uint *)(local_5a0 + 0x10c) =
                                 ~auVar123._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0x10c) & auVar123._12_4_;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598[2].filter + 4);
                            uVar83 = *(uint *)&local_598[2].intersect;
                            uVar84 = *(uint *)((long)&local_598[2].intersect + 4);
                            *(uint *)(local_5a0 + 0x110) =
                                 *(uint *)(local_5a0 + 0x110) & auVar123._0_4_ |
                                 ~auVar123._0_4_ & *(uint *)&local_598[2].filter;
                            *(RTCFeatureFlags *)(local_5a0 + 0x114) =
                                 *(RTCFeatureFlags *)(local_5a0 + 0x114) & auVar123._4_4_ |
                                 ~auVar123._4_4_ & RVar29;
                            *(uint *)(local_5a0 + 0x118) =
                                 *(uint *)(local_5a0 + 0x118) & auVar123._8_4_ |
                                 ~auVar123._8_4_ & uVar83;
                            *(uint *)(local_5a0 + 0x11c) =
                                 *(uint *)(local_5a0 + 0x11c) & auVar123._12_4_ |
                                 ~auVar123._12_4_ & uVar84;
                            RVar29 = local_598[3].feature_mask;
                            uVar83 = *(uint *)&local_598[3].context;
                            uVar84 = *(uint *)((long)&local_598[3].context + 4);
                            *(RTCRayQueryFlags *)(local_5a0 + 0x120) =
                                 *(uint *)(local_5a0 + 0x120) & auVar123._0_4_ |
                                 ~auVar123._0_4_ & local_598[3].flags;
                            *(RTCFeatureFlags *)(local_5a0 + 0x124) =
                                 *(RTCFeatureFlags *)(local_5a0 + 0x124) & auVar123._4_4_ |
                                 ~auVar123._4_4_ & RVar29;
                            *(uint *)(local_5a0 + 0x128) =
                                 *(uint *)(local_5a0 + 0x128) & auVar123._8_4_ |
                                 ~auVar123._8_4_ & uVar83;
                            *(uint *)(local_5a0 + 300) =
                                 *(uint *)(local_5a0 + 300) & auVar123._12_4_ |
                                 ~auVar123._12_4_ & uVar84;
                            RVar29 = *(RTCFeatureFlags *)((long)&local_598[3].filter + 4);
                            uVar83 = *(uint *)&local_598[3].intersect;
                            uVar84 = *(uint *)((long)&local_598[3].intersect + 4);
                            *(uint *)(local_5a0 + 0x130) =
                                 ~auVar123._0_4_ & *(uint *)&local_598[3].filter |
                                 *(uint *)(local_5a0 + 0x130) & auVar123._0_4_;
                            *(RTCFeatureFlags *)(local_5a0 + 0x134) =
                                 ~auVar123._4_4_ & RVar29 |
                                 *(RTCFeatureFlags *)(local_5a0 + 0x134) & auVar123._4_4_;
                            *(uint *)(local_5a0 + 0x138) =
                                 ~auVar123._8_4_ & uVar83 |
                                 *(uint *)(local_5a0 + 0x138) & auVar123._8_4_;
                            *(uint *)(local_5a0 + 0x13c) =
                                 ~auVar123._12_4_ & uVar84 |
                                 *(uint *)(local_5a0 + 0x13c) & auVar123._12_4_;
                            auVar20._0_4_ = local_598[4].flags;
                            auVar20._4_4_ = local_598[4].feature_mask;
                            auVar20._8_8_ = local_598[4].context;
                            *(undefined1 (*) [16])(local_5a0 + 0x140) =
                                 ~auVar123 & auVar20 |
                                 *(undefined1 (*) [16])(local_5a0 + 0x140) & auVar123;
                            pRVar70 = local_5a0;
                            pRVar75 = local_598;
                          }
                        }
                        auVar164._0_4_ = auVar163._0_4_ << 0x1f;
                        auVar164._4_4_ = auVar163._4_4_ << 0x1f;
                        auVar164._8_4_ = auVar163._8_4_ << 0x1f;
                        auVar164._12_4_ = auVar163._12_4_ << 0x1f;
                        iVar65 = movmskps((int)pRVar70,auVar164);
                        uVar69 = CONCAT44((int)((ulong)pRVar70 >> 0x20),iVar65);
                        if (iVar65 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar187;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar78 = lVar78 + -1;
              } while (lVar78 != 0);
              uVar66 = SUB84(pRVar75,0);
              fVar269 = *(float *)(ray + k * 4 + 0x80);
              local_3b8._0_4_ = -(uint)(local_548 <= fVar269) & local_3b8._0_4_;
              local_3b8._4_4_ = -(uint)(fStack_544 <= fVar269) & local_3b8._4_4_;
              local_3b8._8_4_ = -(uint)(fStack_540 <= fVar269) & local_3b8._8_4_;
              local_3b8._12_4_ = -(uint)(fStack_53c <= fVar269) & local_3b8._12_4_;
              uVar74 = (undefined4)(uVar69 >> 0x20);
              iVar65 = movmskps((int)uVar69,local_3b8);
            } while (iVar65 != 0);
            iVar65 = 0;
          }
          auVar211._0_4_ =
               local_588._0_4_ & local_3d8._0_4_ &
               -(uint)(local_578 + (float)local_138._0_4_ <= fVar269);
          auVar211._4_4_ =
               local_588._4_4_ & local_3d8._4_4_ &
               -(uint)(fStack_574 + (float)local_138._4_4_ <= fVar269);
          auVar211._8_4_ =
               (uint)fStack_580 & (uint)fStack_3d0 & -(uint)(fStack_570 + fStack_130 <= fVar269);
          auVar211._12_4_ =
               (uint)fStack_57c & (uint)fStack_3cc & -(uint)(fStack_56c + fStack_12c <= fVar269);
          auVar165._4_4_ = -(uint)(fStack_574 + local_2b8._4_4_ <= fVar269);
          auVar165._0_4_ = -(uint)(local_578 + local_2b8._0_4_ <= fVar269);
          auVar165._8_4_ = -(uint)(fStack_570 + local_2b8._8_4_ <= fVar269);
          auVar165._12_4_ = -(uint)(fStack_56c + local_2b8._12_4_ <= fVar269);
          auVar89 = auVar181 & auVar158 & auVar165 | auVar211;
          iVar65 = movmskps(iVar65,auVar89);
          if (iVar65 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar81 * 0x30) = auVar89;
            auStack_e8[uVar81 * 0xc] =
                 ~auVar211._0_4_ & (uint)local_2b8._0_4_ | local_138._0_4_ & auVar211._0_4_;
            auStack_e8[uVar81 * 0xc + 1] =
                 ~auVar211._4_4_ & (uint)local_2b8._4_4_ | local_138._4_4_ & auVar211._4_4_;
            auStack_e8[uVar81 * 0xc + 2] =
                 ~auVar211._8_4_ & (uint)local_2b8._8_4_ | (uint)fStack_130 & auVar211._8_4_;
            auStack_e8[uVar81 * 0xc + 3] =
                 ~auVar211._12_4_ & (uint)local_2b8._12_4_ | (uint)fStack_12c & auVar211._12_4_;
            (&uStack_d8)[uVar81 * 6] = CONCAT44(fStack_204,local_208);
            aiStack_d0[uVar81 * 0xc] = (int)fVar128 + 1;
            iVar80 = iVar80 + 1;
          }
        }
      }
    }
    if (iVar80 == 0) break;
    fVar128 = *(float *)(ray + k * 4 + 0x80);
    uVar84 = -iVar80;
    pauVar71 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar80 - 1) * 0x30);
    uVar83 = uVar84;
    while( true ) {
      auVar157._0_4_ = -(uint)(local_578 + *(float *)pauVar71[1] <= fVar128) & *(uint *)*pauVar71;
      auVar157._4_4_ =
           -(uint)(fStack_574 + *(float *)(pauVar71[1] + 4) <= fVar128) & *(uint *)(*pauVar71 + 4);
      auVar157._8_4_ =
           -(uint)(fStack_570 + *(float *)(pauVar71[1] + 8) <= fVar128) & *(uint *)(*pauVar71 + 8);
      auVar157._12_4_ =
           -(uint)(fStack_56c + *(float *)(pauVar71[1] + 0xc) <= fVar128) &
           *(uint *)(*pauVar71 + 0xc);
      _local_348 = auVar157;
      iVar65 = movmskps(uVar83,auVar157);
      if (iVar65 != 0) break;
      pauVar71 = pauVar71 + -3;
      uVar84 = uVar84 + 1;
      uVar83 = 0;
      if (uVar84 == 0) {
        uVar66 = 0;
        goto LAB_00adf892;
      }
    }
    auVar179._0_4_ = (uint)*(float *)pauVar71[1] & auVar157._0_4_;
    auVar179._4_4_ = (uint)*(float *)(pauVar71[1] + 4) & auVar157._4_4_;
    auVar179._8_4_ = (uint)*(float *)(pauVar71[1] + 8) & auVar157._8_4_;
    auVar179._12_4_ = (uint)*(float *)(pauVar71[1] + 0xc) & auVar157._12_4_;
    auVar200._0_8_ = CONCAT44(~auVar157._4_4_,~auVar157._0_4_) & 0x7f8000007f800000;
    auVar200._8_4_ = ~auVar157._8_4_ & 0x7f800000;
    auVar200._12_4_ = ~auVar157._12_4_ & 0x7f800000;
    auVar200 = auVar200 | auVar179;
    auVar180._4_4_ = auVar200._0_4_;
    auVar180._0_4_ = auVar200._4_4_;
    auVar180._8_4_ = auVar200._12_4_;
    auVar180._12_4_ = auVar200._8_4_;
    auVar89 = minps(auVar180,auVar200);
    auVar118._0_8_ = auVar89._8_8_;
    auVar118._8_4_ = auVar89._0_4_;
    auVar118._12_4_ = auVar89._4_4_;
    auVar89 = minps(auVar118,auVar89);
    auVar119._0_8_ =
         CONCAT44(-(uint)(auVar89._4_4_ == auVar200._4_4_) & auVar157._4_4_,
                  -(uint)(auVar89._0_4_ == auVar200._0_4_) & auVar157._0_4_);
    auVar119._8_4_ = -(uint)(auVar89._8_4_ == auVar200._8_4_) & auVar157._8_4_;
    auVar119._12_4_ = -(uint)(auVar89._12_4_ == auVar200._12_4_) & auVar157._12_4_;
    iVar65 = movmskps(iVar65,auVar119);
    if (iVar65 != 0) {
      auVar157._8_4_ = auVar119._8_4_;
      auVar157._0_8_ = auVar119._0_8_;
      auVar157._12_4_ = auVar119._12_4_;
    }
    uVar18 = *(undefined8 *)pauVar71[2];
    fVar128 = *(float *)(pauVar71[2] + 8);
    uVar83 = movmskps(iVar65,auVar157);
    pRVar75 = (RTCIntersectArguments *)0x0;
    if (uVar83 != 0) {
      for (; (uVar83 >> (long)pRVar75 & 1) == 0;
          pRVar75 = (RTCIntersectArguments *)((long)&pRVar75->flags + 1)) {
      }
    }
    *(undefined4 *)(local_348 + (long)pRVar75 * 4) = 0;
    *pauVar71 = _local_348;
    iVar65 = movmskps((int)pauVar71,_local_348);
    lVar68 = CONCAT44((int)((ulong)pauVar71 >> 0x20),iVar65);
    uVar83 = ~uVar84;
    if (iVar65 != 0) {
      uVar83 = -uVar84;
    }
    uVar81 = (ulong)uVar83;
    fVar168 = (float)uVar18;
    fVar185 = (float)((ulong)uVar18 >> 0x20) - fVar168;
    _local_5b8 = (int *)CONCAT44(fVar185 * 0.33333334 + fVar168,fVar185 * 0.0 + fVar168);
    uStack_5b0 = (void *)CONCAT44(fVar185 * 1.0 + fVar168,fVar185 * 0.6666667 + fVar168);
    local_208 = *(float *)(local_5b8 + (long)pRVar75 * 4);
    fStack_204 = *(float *)(local_5b8 + (long)pRVar75 * 4 + 4);
  } while( true );
LAB_00adf892:
  fVar186 = *(float *)(ray + k * 4 + 0x80);
  auVar166._4_4_ = -(uint)(fStack_294 <= fVar186);
  auVar166._0_4_ = -(uint)(local_298 <= fVar186);
  auVar166._8_4_ = -(uint)(fStack_290 <= fVar186);
  auVar166._12_4_ = -(uint)(fStack_28c <= fVar186);
  uVar82 = movmskps(uVar66,auVar166);
  uVar82 = (uint)local_390 - 1 & (uint)local_390 & uVar82;
  if (uVar82 == 0) {
    return;
  }
  goto LAB_00adcdb7;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }